

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::sse2::CurveNiIntersectorK<4,4>::
     intersect_n<embree::sse2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::sse2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined8 *puVar2;
  undefined1 (*pauVar3) [12];
  Primitive *pPVar4;
  undefined4 uVar5;
  Primitive PVar6;
  undefined4 uVar7;
  Geometry *pGVar8;
  void *pvVar9;
  __int_type_conflict _Var10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined3 uVar23;
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined8 uVar27;
  uint uVar28;
  undefined8 uVar29;
  undefined6 uVar30;
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  bool bVar48;
  bool bVar49;
  RayQueryContext *pRVar50;
  byte bVar51;
  ulong uVar52;
  RTCFilterFunctionN p_Var53;
  RTCRayN *pRVar54;
  ulong uVar55;
  bool bVar56;
  uint uVar57;
  int iVar58;
  uint uVar59;
  int iVar60;
  uint uVar61;
  uint uVar62;
  float fVar63;
  float fVar91;
  float fVar92;
  vfloat_impl<4> p00;
  undefined1 auVar64 [16];
  undefined2 uVar90;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  short sVar93;
  float fVar94;
  float fVar128;
  float fVar129;
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  undefined1 auVar101 [16];
  undefined1 auVar104 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float t1;
  float fVar130;
  float fVar140;
  float fVar141;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar142;
  float fVar143;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar144;
  float fVar149;
  float fVar150;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar151;
  float fVar164;
  float fVar165;
  vfloat4 v;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar166;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar167;
  float fVar168;
  float fVar182;
  float fVar184;
  vfloat4 a;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar183;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar188;
  float fVar189;
  float fVar205;
  float fVar207;
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  undefined1 auVar196 [16];
  undefined1 auVar199 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar206;
  float fVar208;
  float fVar209;
  undefined1 auVar204 [16];
  float fVar210;
  float fVar219;
  float fVar221;
  undefined1 auVar211 [16];
  float fVar220;
  float fVar222;
  float fVar223;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar224;
  float fVar225;
  float fVar235;
  float fVar237;
  undefined1 auVar226 [16];
  float fVar236;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar244;
  float fVar257;
  float fVar261;
  undefined1 auVar249 [16];
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar295;
  float fVar299;
  vfloat4 a_1;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  float fVar306;
  float fVar307;
  float fVar315;
  float fVar318;
  undefined1 auVar308 [16];
  float fVar321;
  undefined1 auVar311 [16];
  float fVar316;
  float fVar317;
  float fVar319;
  float fVar320;
  float fVar322;
  float fVar323;
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar333;
  float fVar336;
  float fVar339;
  undefined1 auVar329 [16];
  float fVar334;
  float fVar335;
  float fVar337;
  float fVar338;
  float fVar340;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  float fVar355;
  float fVar358;
  float fVar359;
  undefined1 auVar356 [16];
  float fVar360;
  undefined1 auVar357 [16];
  undefined1 local_548 [8];
  float fStack_540;
  float fStack_53c;
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  BBox1f local_528;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  undefined1 local_418 [16];
  undefined1 (*local_400) [16];
  RayQueryContext *local_3f8;
  ulong local_3f0;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 uVar127;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  
  PVar6 = prim[1];
  uVar55 = (ulong)(byte)PVar6;
  pPVar4 = prim + uVar55 * 0x19 + 6;
  fVar150 = *(float *)(pPVar4 + 0xc);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar151 = (*(float *)(ray + k * 4) - *(float *)pPVar4) * fVar150;
  fVar164 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar4 + 4)) * fVar150;
  fVar165 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar4 + 8)) * fVar150;
  fVar144 = *(float *)(ray + k * 4 + 0x40) * fVar150;
  fVar149 = *(float *)(ray + k * 4 + 0x50) * fVar150;
  fVar150 = *(float *)(ray + k * 4 + 0x60) * fVar150;
  uVar7 = *(undefined4 *)(prim + uVar55 * 4 + 6);
  uVar127 = (undefined1)((uint)uVar7 >> 0x18);
  uVar90 = CONCAT11(uVar127,uVar127);
  uVar127 = (undefined1)((uint)uVar7 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar90,uVar127),CONCAT14(uVar127,uVar7));
  uVar127 = (undefined1)((uint)uVar7 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar127),uVar127);
  sVar93 = CONCAT11((char)uVar7,(char)uVar7);
  uVar52 = CONCAT62(uVar30,sVar93);
  auVar97._8_4_ = 0;
  auVar97._0_8_ = uVar52;
  auVar97._12_2_ = uVar90;
  auVar97._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar96._12_4_ = auVar97._12_4_;
  auVar96._8_2_ = 0;
  auVar96._0_8_ = uVar52;
  auVar96._10_2_ = uVar90;
  auVar95._10_6_ = auVar96._10_6_;
  auVar95._8_2_ = uVar90;
  auVar95._0_8_ = uVar52;
  uVar90 = (undefined2)uVar30;
  auVar31._4_8_ = auVar95._8_8_;
  auVar31._2_2_ = uVar90;
  auVar31._0_2_ = uVar90;
  fVar130 = (float)((int)sVar93 >> 8);
  fVar140 = (float)(auVar31._0_4_ >> 0x18);
  fVar141 = (float)(auVar95._8_4_ >> 0x18);
  uVar7 = *(undefined4 *)(prim + uVar55 * 5 + 6);
  uVar127 = (undefined1)((uint)uVar7 >> 0x18);
  uVar90 = CONCAT11(uVar127,uVar127);
  uVar127 = (undefined1)((uint)uVar7 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar90,uVar127),CONCAT14(uVar127,uVar7));
  uVar127 = (undefined1)((uint)uVar7 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar127),uVar127);
  sVar93 = CONCAT11((char)uVar7,(char)uVar7);
  uVar52 = CONCAT62(uVar30,sVar93);
  auVar100._8_4_ = 0;
  auVar100._0_8_ = uVar52;
  auVar100._12_2_ = uVar90;
  auVar100._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar99._12_4_ = auVar100._12_4_;
  auVar99._8_2_ = 0;
  auVar99._0_8_ = uVar52;
  auVar99._10_2_ = uVar90;
  auVar98._10_6_ = auVar99._10_6_;
  auVar98._8_2_ = uVar90;
  auVar98._0_8_ = uVar52;
  uVar90 = (undefined2)uVar30;
  auVar32._4_8_ = auVar98._8_8_;
  auVar32._2_2_ = uVar90;
  auVar32._0_2_ = uVar90;
  fVar167 = (float)((int)sVar93 >> 8);
  fVar182 = (float)(auVar32._0_4_ >> 0x18);
  fVar184 = (float)(auVar98._8_4_ >> 0x18);
  uVar7 = *(undefined4 *)(prim + uVar55 * 6 + 6);
  uVar127 = (undefined1)((uint)uVar7 >> 0x18);
  uVar90 = CONCAT11(uVar127,uVar127);
  uVar127 = (undefined1)((uint)uVar7 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar90,uVar127),CONCAT14(uVar127,uVar7));
  uVar127 = (undefined1)((uint)uVar7 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar127),uVar127);
  sVar93 = CONCAT11((char)uVar7,(char)uVar7);
  uVar52 = CONCAT62(uVar30,sVar93);
  auVar103._8_4_ = 0;
  auVar103._0_8_ = uVar52;
  auVar103._12_2_ = uVar90;
  auVar103._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar102._12_4_ = auVar103._12_4_;
  auVar102._8_2_ = 0;
  auVar102._0_8_ = uVar52;
  auVar102._10_2_ = uVar90;
  auVar101._10_6_ = auVar102._10_6_;
  auVar101._8_2_ = uVar90;
  auVar101._0_8_ = uVar52;
  uVar90 = (undefined2)uVar30;
  auVar33._4_8_ = auVar101._8_8_;
  auVar33._2_2_ = uVar90;
  auVar33._0_2_ = uVar90;
  fVar224 = (float)((int)sVar93 >> 8);
  fVar235 = (float)(auVar33._0_4_ >> 0x18);
  fVar237 = (float)(auVar101._8_4_ >> 0x18);
  uVar7 = *(undefined4 *)(prim + uVar55 * 0xb + 6);
  uVar127 = (undefined1)((uint)uVar7 >> 0x18);
  uVar90 = CONCAT11(uVar127,uVar127);
  uVar127 = (undefined1)((uint)uVar7 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar90,uVar127),CONCAT14(uVar127,uVar7));
  uVar127 = (undefined1)((uint)uVar7 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar127),uVar127);
  sVar93 = CONCAT11((char)uVar7,(char)uVar7);
  uVar52 = CONCAT62(uVar30,sVar93);
  auVar106._8_4_ = 0;
  auVar106._0_8_ = uVar52;
  auVar106._12_2_ = uVar90;
  auVar106._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar105._12_4_ = auVar106._12_4_;
  auVar105._8_2_ = 0;
  auVar105._0_8_ = uVar52;
  auVar105._10_2_ = uVar90;
  auVar104._10_6_ = auVar105._10_6_;
  auVar104._8_2_ = uVar90;
  auVar104._0_8_ = uVar52;
  uVar90 = (undefined2)uVar30;
  auVar34._4_8_ = auVar104._8_8_;
  auVar34._2_2_ = uVar90;
  auVar34._0_2_ = uVar90;
  fVar63 = (float)((int)sVar93 >> 8);
  fVar91 = (float)(auVar34._0_4_ >> 0x18);
  fVar92 = (float)(auVar104._8_4_ >> 0x18);
  uVar7 = *(undefined4 *)(prim + uVar55 * 0xc + 6);
  uVar127 = (undefined1)((uint)uVar7 >> 0x18);
  uVar90 = CONCAT11(uVar127,uVar127);
  uVar127 = (undefined1)((uint)uVar7 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar90,uVar127),CONCAT14(uVar127,uVar7));
  uVar127 = (undefined1)((uint)uVar7 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar127),uVar127);
  sVar93 = CONCAT11((char)uVar7,(char)uVar7);
  uVar52 = CONCAT62(uVar30,sVar93);
  auVar192._8_4_ = 0;
  auVar192._0_8_ = uVar52;
  auVar192._12_2_ = uVar90;
  auVar192._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar191._12_4_ = auVar192._12_4_;
  auVar191._8_2_ = 0;
  auVar191._0_8_ = uVar52;
  auVar191._10_2_ = uVar90;
  auVar190._10_6_ = auVar191._10_6_;
  auVar190._8_2_ = uVar90;
  auVar190._0_8_ = uVar52;
  uVar90 = (undefined2)uVar30;
  auVar35._4_8_ = auVar190._8_8_;
  auVar35._2_2_ = uVar90;
  auVar35._0_2_ = uVar90;
  fVar210 = (float)((int)sVar93 >> 8);
  fVar219 = (float)(auVar35._0_4_ >> 0x18);
  fVar221 = (float)(auVar190._8_4_ >> 0x18);
  uVar7 = *(undefined4 *)(prim + uVar55 * 0xd + 6);
  uVar127 = (undefined1)((uint)uVar7 >> 0x18);
  uVar90 = CONCAT11(uVar127,uVar127);
  uVar127 = (undefined1)((uint)uVar7 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar90,uVar127),CONCAT14(uVar127,uVar7));
  uVar127 = (undefined1)((uint)uVar7 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar127),uVar127);
  sVar93 = CONCAT11((char)uVar7,(char)uVar7);
  uVar52 = CONCAT62(uVar30,sVar93);
  auVar195._8_4_ = 0;
  auVar195._0_8_ = uVar52;
  auVar195._12_2_ = uVar90;
  auVar195._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar194._12_4_ = auVar195._12_4_;
  auVar194._8_2_ = 0;
  auVar194._0_8_ = uVar52;
  auVar194._10_2_ = uVar90;
  auVar193._10_6_ = auVar194._10_6_;
  auVar193._8_2_ = uVar90;
  auVar193._0_8_ = uVar52;
  uVar90 = (undefined2)uVar30;
  auVar36._4_8_ = auVar193._8_8_;
  auVar36._2_2_ = uVar90;
  auVar36._0_2_ = uVar90;
  fVar267 = (float)((int)sVar93 >> 8);
  fVar276 = (float)(auVar36._0_4_ >> 0x18);
  fVar280 = (float)(auVar193._8_4_ >> 0x18);
  uVar7 = *(undefined4 *)(prim + uVar55 * 0x12 + 6);
  uVar127 = (undefined1)((uint)uVar7 >> 0x18);
  uVar90 = CONCAT11(uVar127,uVar127);
  uVar127 = (undefined1)((uint)uVar7 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar90,uVar127),CONCAT14(uVar127,uVar7));
  uVar127 = (undefined1)((uint)uVar7 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar127),uVar127);
  sVar93 = CONCAT11((char)uVar7,(char)uVar7);
  uVar52 = CONCAT62(uVar30,sVar93);
  auVar198._8_4_ = 0;
  auVar198._0_8_ = uVar52;
  auVar198._12_2_ = uVar90;
  auVar198._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar197._12_4_ = auVar198._12_4_;
  auVar197._8_2_ = 0;
  auVar197._0_8_ = uVar52;
  auVar197._10_2_ = uVar90;
  auVar196._10_6_ = auVar197._10_6_;
  auVar196._8_2_ = uVar90;
  auVar196._0_8_ = uVar52;
  uVar90 = (undefined2)uVar30;
  auVar37._4_8_ = auVar196._8_8_;
  auVar37._2_2_ = uVar90;
  auVar37._0_2_ = uVar90;
  fVar244 = (float)((int)sVar93 >> 8);
  fVar257 = (float)(auVar37._0_4_ >> 0x18);
  fVar261 = (float)(auVar196._8_4_ >> 0x18);
  uVar7 = *(undefined4 *)(prim + uVar55 * 0x13 + 6);
  uVar127 = (undefined1)((uint)uVar7 >> 0x18);
  uVar90 = CONCAT11(uVar127,uVar127);
  uVar127 = (undefined1)((uint)uVar7 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar90,uVar127),CONCAT14(uVar127,uVar7));
  uVar127 = (undefined1)((uint)uVar7 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar127),uVar127);
  sVar93 = CONCAT11((char)uVar7,(char)uVar7);
  uVar52 = CONCAT62(uVar30,sVar93);
  auVar201._8_4_ = 0;
  auVar201._0_8_ = uVar52;
  auVar201._12_2_ = uVar90;
  auVar201._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar200._12_4_ = auVar201._12_4_;
  auVar200._8_2_ = 0;
  auVar200._0_8_ = uVar52;
  auVar200._10_2_ = uVar90;
  auVar199._10_6_ = auVar200._10_6_;
  auVar199._8_2_ = uVar90;
  auVar199._0_8_ = uVar52;
  uVar90 = (undefined2)uVar30;
  auVar38._4_8_ = auVar199._8_8_;
  auVar38._2_2_ = uVar90;
  auVar38._0_2_ = uVar90;
  fVar287 = (float)((int)sVar93 >> 8);
  fVar295 = (float)(auVar38._0_4_ >> 0x18);
  fVar299 = (float)(auVar199._8_4_ >> 0x18);
  uVar7 = *(undefined4 *)(prim + uVar55 * 0x14 + 6);
  uVar127 = (undefined1)((uint)uVar7 >> 0x18);
  uVar90 = CONCAT11(uVar127,uVar127);
  uVar127 = (undefined1)((uint)uVar7 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar90,uVar127),CONCAT14(uVar127,uVar7));
  uVar127 = (undefined1)((uint)uVar7 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar127),uVar127);
  sVar93 = CONCAT11((char)uVar7,(char)uVar7);
  uVar52 = CONCAT62(uVar30,sVar93);
  auVar310._8_4_ = 0;
  auVar310._0_8_ = uVar52;
  auVar310._12_2_ = uVar90;
  auVar310._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar309._12_4_ = auVar310._12_4_;
  auVar309._8_2_ = 0;
  auVar309._0_8_ = uVar52;
  auVar309._10_2_ = uVar90;
  auVar308._10_6_ = auVar309._10_6_;
  auVar308._8_2_ = uVar90;
  auVar308._0_8_ = uVar52;
  uVar90 = (undefined2)uVar30;
  auVar39._4_8_ = auVar308._8_8_;
  auVar39._2_2_ = uVar90;
  auVar39._0_2_ = uVar90;
  fVar94 = (float)((int)sVar93 >> 8);
  fVar128 = (float)(auVar39._0_4_ >> 0x18);
  fVar129 = (float)(auVar308._8_4_ >> 0x18);
  fVar324 = fVar144 * fVar130 + fVar149 * fVar167 + fVar150 * fVar224;
  fVar333 = fVar144 * fVar140 + fVar149 * fVar182 + fVar150 * fVar235;
  fVar336 = fVar144 * fVar141 + fVar149 * fVar184 + fVar150 * fVar237;
  fVar339 = fVar144 * (float)(auVar96._12_4_ >> 0x18) +
            fVar149 * (float)(auVar99._12_4_ >> 0x18) + fVar150 * (float)(auVar102._12_4_ >> 0x18);
  fVar306 = fVar144 * fVar63 + fVar149 * fVar210 + fVar150 * fVar267;
  fVar315 = fVar144 * fVar91 + fVar149 * fVar219 + fVar150 * fVar276;
  fVar318 = fVar144 * fVar92 + fVar149 * fVar221 + fVar150 * fVar280;
  fVar321 = fVar144 * (float)(auVar105._12_4_ >> 0x18) +
            fVar149 * (float)(auVar191._12_4_ >> 0x18) + fVar150 * (float)(auVar194._12_4_ >> 0x18);
  fVar188 = fVar144 * fVar244 + fVar149 * fVar287 + fVar150 * fVar94;
  fVar205 = fVar144 * fVar257 + fVar149 * fVar295 + fVar150 * fVar128;
  fVar207 = fVar144 * fVar261 + fVar149 * fVar299 + fVar150 * fVar129;
  fVar144 = fVar144 * (float)(auVar197._12_4_ >> 0x18) +
            fVar149 * (float)(auVar200._12_4_ >> 0x18) + fVar150 * (float)(auVar309._12_4_ >> 0x18);
  fVar167 = fVar130 * fVar151 + fVar167 * fVar164 + fVar224 * fVar165;
  fVar182 = fVar140 * fVar151 + fVar182 * fVar164 + fVar235 * fVar165;
  fVar184 = fVar141 * fVar151 + fVar184 * fVar164 + fVar237 * fVar165;
  fVar224 = (float)(auVar96._12_4_ >> 0x18) * fVar151 +
            (float)(auVar99._12_4_ >> 0x18) * fVar164 + (float)(auVar102._12_4_ >> 0x18) * fVar165;
  fVar235 = fVar63 * fVar151 + fVar210 * fVar164 + fVar267 * fVar165;
  fVar237 = fVar91 * fVar151 + fVar219 * fVar164 + fVar276 * fVar165;
  fVar267 = fVar92 * fVar151 + fVar221 * fVar164 + fVar280 * fVar165;
  fVar276 = (float)(auVar105._12_4_ >> 0x18) * fVar151 +
            (float)(auVar191._12_4_ >> 0x18) * fVar164 + (float)(auVar194._12_4_ >> 0x18) * fVar165;
  fVar210 = fVar151 * fVar244 + fVar164 * fVar287 + fVar165 * fVar94;
  fVar219 = fVar151 * fVar257 + fVar164 * fVar295 + fVar165 * fVar128;
  fVar221 = fVar151 * fVar261 + fVar164 * fVar299 + fVar165 * fVar129;
  fVar151 = fVar151 * (float)(auVar197._12_4_ >> 0x18) +
            fVar164 * (float)(auVar200._12_4_ >> 0x18) + fVar165 * (float)(auVar309._12_4_ >> 0x18);
  fVar150 = (float)DAT_01f4bd50;
  fVar63 = DAT_01f4bd50._4_4_;
  fVar91 = DAT_01f4bd50._8_4_;
  fVar92 = DAT_01f4bd50._12_4_;
  uVar57 = -(uint)(fVar150 <= ABS(fVar324));
  uVar59 = -(uint)(fVar63 <= ABS(fVar333));
  uVar61 = -(uint)(fVar91 <= ABS(fVar336));
  uVar62 = -(uint)(fVar92 <= ABS(fVar339));
  auVar329._0_4_ = (uint)fVar324 & uVar57;
  auVar329._4_4_ = (uint)fVar333 & uVar59;
  auVar329._8_4_ = (uint)fVar336 & uVar61;
  auVar329._12_4_ = (uint)fVar339 & uVar62;
  auVar152._0_4_ = ~uVar57 & (uint)fVar150;
  auVar152._4_4_ = ~uVar59 & (uint)fVar63;
  auVar152._8_4_ = ~uVar61 & (uint)fVar91;
  auVar152._12_4_ = ~uVar62 & (uint)fVar92;
  auVar152 = auVar152 | auVar329;
  uVar57 = -(uint)(fVar150 <= ABS(fVar306));
  uVar59 = -(uint)(fVar63 <= ABS(fVar315));
  uVar61 = -(uint)(fVar91 <= ABS(fVar318));
  uVar62 = -(uint)(fVar92 <= ABS(fVar321));
  auVar311._0_4_ = (uint)fVar306 & uVar57;
  auVar311._4_4_ = (uint)fVar315 & uVar59;
  auVar311._8_4_ = (uint)fVar318 & uVar61;
  auVar311._12_4_ = (uint)fVar321 & uVar62;
  auVar169._0_4_ = ~uVar57 & (uint)fVar150;
  auVar169._4_4_ = ~uVar59 & (uint)fVar63;
  auVar169._8_4_ = ~uVar61 & (uint)fVar91;
  auVar169._12_4_ = ~uVar62 & (uint)fVar92;
  auVar169 = auVar169 | auVar311;
  uVar57 = -(uint)(fVar150 <= ABS(fVar188));
  uVar59 = -(uint)(fVar63 <= ABS(fVar205));
  uVar61 = -(uint)(fVar91 <= ABS(fVar207));
  uVar62 = -(uint)(fVar92 <= ABS(fVar144));
  auVar202._0_4_ = (uint)fVar188 & uVar57;
  auVar202._4_4_ = (uint)fVar205 & uVar59;
  auVar202._8_4_ = (uint)fVar207 & uVar61;
  auVar202._12_4_ = (uint)fVar144 & uVar62;
  auVar249._0_4_ = ~uVar57 & (uint)fVar150;
  auVar249._4_4_ = ~uVar59 & (uint)fVar63;
  auVar249._8_4_ = ~uVar61 & (uint)fVar91;
  auVar249._12_4_ = ~uVar62 & (uint)fVar92;
  auVar249 = auVar249 | auVar202;
  auVar64 = rcpps(_DAT_01f4bd50,auVar152);
  fVar150 = auVar64._0_4_;
  fVar92 = auVar64._4_4_;
  fVar129 = auVar64._8_4_;
  fVar141 = auVar64._12_4_;
  fVar150 = (1.0 - auVar152._0_4_ * fVar150) * fVar150 + fVar150;
  fVar92 = (1.0 - auVar152._4_4_ * fVar92) * fVar92 + fVar92;
  fVar129 = (1.0 - auVar152._8_4_ * fVar129) * fVar129 + fVar129;
  fVar141 = (1.0 - auVar152._12_4_ * fVar141) * fVar141 + fVar141;
  auVar64 = rcpps(auVar64,auVar169);
  fVar63 = auVar64._0_4_;
  fVar94 = auVar64._4_4_;
  fVar130 = auVar64._8_4_;
  fVar144 = auVar64._12_4_;
  fVar63 = (1.0 - auVar169._0_4_ * fVar63) * fVar63 + fVar63;
  fVar94 = (1.0 - auVar169._4_4_ * fVar94) * fVar94 + fVar94;
  fVar130 = (1.0 - auVar169._8_4_ * fVar130) * fVar130 + fVar130;
  fVar144 = (1.0 - auVar169._12_4_ * fVar144) * fVar144 + fVar144;
  auVar64 = rcpps(auVar64,auVar249);
  fVar91 = auVar64._0_4_;
  fVar128 = auVar64._4_4_;
  fVar140 = auVar64._8_4_;
  fVar149 = auVar64._12_4_;
  fVar91 = (1.0 - auVar249._0_4_ * fVar91) * fVar91 + fVar91;
  fVar128 = (1.0 - auVar249._4_4_ * fVar128) * fVar128 + fVar128;
  fVar140 = (1.0 - auVar249._8_4_ * fVar140) * fVar140 + fVar140;
  fVar149 = (1.0 - auVar249._12_4_ * fVar149) * fVar149 + fVar149;
  uVar52 = *(ulong *)(prim + uVar55 * 7 + 6);
  uVar90 = (undefined2)(uVar52 >> 0x30);
  auVar64._8_4_ = 0;
  auVar64._0_8_ = uVar52;
  auVar64._12_2_ = uVar90;
  auVar64._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar52 >> 0x20);
  auVar171._12_4_ = auVar64._12_4_;
  auVar171._8_2_ = 0;
  auVar171._0_8_ = uVar52;
  auVar171._10_2_ = uVar90;
  auVar111._10_6_ = auVar171._10_6_;
  auVar111._8_2_ = uVar90;
  auVar111._0_8_ = uVar52;
  uVar90 = (undefined2)(uVar52 >> 0x10);
  auVar40._4_8_ = auVar111._8_8_;
  auVar40._2_2_ = uVar90;
  auVar40._0_2_ = uVar90;
  auVar153._0_8_ =
       CONCAT44(((float)(auVar40._0_4_ >> 0x10) - fVar182) * fVar92,
                ((float)(int)(short)uVar52 - fVar167) * fVar150);
  auVar153._8_4_ = ((float)(auVar111._8_4_ >> 0x10) - fVar184) * fVar129;
  auVar153._12_4_ = ((float)(auVar171._12_4_ >> 0x10) - fVar224) * fVar141;
  uVar52 = *(ulong *)(prim + uVar55 * 9 + 6);
  uVar90 = (undefined2)(uVar52 >> 0x30);
  auVar65._8_4_ = 0;
  auVar65._0_8_ = uVar52;
  auVar65._12_2_ = uVar90;
  auVar65._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar52 >> 0x20);
  auVar133._12_4_ = auVar65._12_4_;
  auVar133._8_2_ = 0;
  auVar133._0_8_ = uVar52;
  auVar133._10_2_ = uVar90;
  auVar251._10_6_ = auVar133._10_6_;
  auVar251._8_2_ = uVar90;
  auVar251._0_8_ = uVar52;
  uVar90 = (undefined2)(uVar52 >> 0x10);
  auVar41._4_8_ = auVar251._8_8_;
  auVar41._2_2_ = uVar90;
  auVar41._0_2_ = uVar90;
  auVar203._0_4_ = ((float)(int)(short)uVar52 - fVar167) * fVar150;
  auVar203._4_4_ = ((float)(auVar41._0_4_ >> 0x10) - fVar182) * fVar92;
  auVar203._8_4_ = ((float)(auVar251._8_4_ >> 0x10) - fVar184) * fVar129;
  auVar203._12_4_ = ((float)(auVar133._12_4_ >> 0x10) - fVar224) * fVar141;
  uVar52 = *(ulong *)(prim + uVar55 * 0xe + 6);
  uVar90 = (undefined2)(uVar52 >> 0x30);
  auVar68._8_4_ = 0;
  auVar68._0_8_ = uVar52;
  auVar68._12_2_ = uVar90;
  auVar68._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar52 >> 0x20);
  auVar67._12_4_ = auVar68._12_4_;
  auVar67._8_2_ = 0;
  auVar67._0_8_ = uVar52;
  auVar67._10_2_ = uVar90;
  auVar66._10_6_ = auVar67._10_6_;
  auVar66._8_2_ = uVar90;
  auVar66._0_8_ = uVar52;
  uVar90 = (undefined2)(uVar52 >> 0x10);
  auVar42._4_8_ = auVar66._8_8_;
  auVar42._2_2_ = uVar90;
  auVar42._0_2_ = uVar90;
  auVar131._0_8_ =
       CONCAT44(((float)(auVar42._0_4_ >> 0x10) - fVar237) * fVar94,
                ((float)(int)(short)uVar52 - fVar235) * fVar63);
  auVar131._8_4_ = ((float)(auVar66._8_4_ >> 0x10) - fVar267) * fVar130;
  auVar131._12_4_ = ((float)(auVar67._12_4_ >> 0x10) - fVar276) * fVar144;
  uVar52 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  uVar90 = (undefined2)(uVar52 >> 0x30);
  auVar71._8_4_ = 0;
  auVar71._0_8_ = uVar52;
  auVar71._12_2_ = uVar90;
  auVar71._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar52 >> 0x20);
  auVar70._12_4_ = auVar71._12_4_;
  auVar70._8_2_ = 0;
  auVar70._0_8_ = uVar52;
  auVar70._10_2_ = uVar90;
  auVar69._10_6_ = auVar70._10_6_;
  auVar69._8_2_ = uVar90;
  auVar69._0_8_ = uVar52;
  uVar90 = (undefined2)(uVar52 >> 0x10);
  auVar43._4_8_ = auVar69._8_8_;
  auVar43._2_2_ = uVar90;
  auVar43._0_2_ = uVar90;
  auVar226._0_4_ = ((float)(int)(short)uVar52 - fVar235) * fVar63;
  auVar226._4_4_ = ((float)(auVar43._0_4_ >> 0x10) - fVar237) * fVar94;
  auVar226._8_4_ = ((float)(auVar69._8_4_ >> 0x10) - fVar267) * fVar130;
  auVar226._12_4_ = ((float)(auVar70._12_4_ >> 0x10) - fVar276) * fVar144;
  uVar52 = *(ulong *)(prim + uVar55 * 0x15 + 6);
  uVar90 = (undefined2)(uVar52 >> 0x30);
  auVar74._8_4_ = 0;
  auVar74._0_8_ = uVar52;
  auVar74._12_2_ = uVar90;
  auVar74._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar52 >> 0x20);
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._8_2_ = 0;
  auVar73._0_8_ = uVar52;
  auVar73._10_2_ = uVar90;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._8_2_ = uVar90;
  auVar72._0_8_ = uVar52;
  uVar90 = (undefined2)(uVar52 >> 0x10);
  auVar44._4_8_ = auVar72._8_8_;
  auVar44._2_2_ = uVar90;
  auVar44._0_2_ = uVar90;
  auVar107._0_8_ =
       CONCAT44(((float)(auVar44._0_4_ >> 0x10) - fVar219) * fVar128,
                ((float)(int)(short)uVar52 - fVar210) * fVar91);
  auVar107._8_4_ = ((float)(auVar72._8_4_ >> 0x10) - fVar221) * fVar140;
  auVar107._12_4_ = ((float)(auVar73._12_4_ >> 0x10) - fVar151) * fVar149;
  uVar52 = *(ulong *)(prim + uVar55 * 0x17 + 6);
  uVar90 = (undefined2)(uVar52 >> 0x30);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar52;
  auVar77._12_2_ = uVar90;
  auVar77._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar52 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar52;
  auVar76._10_2_ = uVar90;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar90;
  auVar75._0_8_ = uVar52;
  uVar90 = (undefined2)(uVar52 >> 0x10);
  auVar45._4_8_ = auVar75._8_8_;
  auVar45._2_2_ = uVar90;
  auVar45._0_2_ = uVar90;
  auVar78._0_4_ = ((float)(int)(short)uVar52 - fVar210) * fVar91;
  auVar78._4_4_ = ((float)(auVar45._0_4_ >> 0x10) - fVar219) * fVar128;
  auVar78._8_4_ = ((float)(auVar75._8_4_ >> 0x10) - fVar221) * fVar140;
  auVar78._12_4_ = ((float)(auVar76._12_4_ >> 0x10) - fVar151) * fVar149;
  auVar170._8_4_ = auVar153._8_4_;
  auVar170._0_8_ = auVar153._0_8_;
  auVar170._12_4_ = auVar153._12_4_;
  auVar171 = minps(auVar170,auVar203);
  auVar145._8_4_ = auVar131._8_4_;
  auVar145._0_8_ = auVar131._0_8_;
  auVar145._12_4_ = auVar131._12_4_;
  auVar64 = minps(auVar145,auVar226);
  auVar171 = maxps(auVar171,auVar64);
  auVar146._8_4_ = auVar107._8_4_;
  auVar146._0_8_ = auVar107._0_8_;
  auVar146._12_4_ = auVar107._12_4_;
  auVar64 = minps(auVar146,auVar78);
  auVar211._4_4_ = uVar5;
  auVar211._0_4_ = uVar5;
  auVar211._8_4_ = uVar5;
  auVar211._12_4_ = uVar5;
  auVar64 = maxps(auVar64,auVar211);
  auVar64 = maxps(auVar171,auVar64);
  fVar150 = auVar64._0_4_ * 0.99999964;
  fVar63 = auVar64._4_4_ * 0.99999964;
  fVar91 = auVar64._8_4_ * 0.99999964;
  fVar92 = auVar64._12_4_ * 0.99999964;
  auVar171 = maxps(auVar153,auVar203);
  auVar64 = maxps(auVar131,auVar226);
  auVar171 = minps(auVar171,auVar64);
  auVar64 = maxps(auVar107,auVar78);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar79._4_4_ = uVar5;
  auVar79._0_4_ = uVar5;
  auVar79._8_4_ = uVar5;
  auVar79._12_4_ = uVar5;
  auVar64 = minps(auVar64,auVar79);
  auVar64 = minps(auVar171,auVar64);
  auVar108._0_4_ = -(uint)(PVar6 != (Primitive)0x0 && fVar150 <= auVar64._0_4_ * 1.0000004);
  auVar108._4_4_ = -(uint)(1 < (byte)PVar6 && fVar63 <= auVar64._4_4_ * 1.0000004);
  auVar108._8_4_ = -(uint)(2 < (byte)PVar6 && fVar91 <= auVar64._8_4_ * 1.0000004);
  auVar108._12_4_ = -(uint)(3 < (byte)PVar6 && fVar92 <= auVar64._12_4_ * 1.0000004);
  uVar57 = movmskps((uint)(byte)PVar6,auVar108);
  local_400 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar15 = (int)mm_lookupmask_ps._240_4_ < 0;
  bVar16 = (int)mm_lookupmask_ps._244_4_ < 0;
  bVar17 = (int)mm_lookupmask_ps._248_4_ < 0;
  local_3f8 = context;
LAB_0030eee4:
  pRVar50 = local_3f8;
  local_3f0 = (ulong)uVar57;
  if (local_3f0 == 0) {
    return;
  }
  lVar11 = 0;
  if (local_3f0 != 0) {
    for (; (uVar57 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
    }
  }
  uVar57 = *(uint *)(prim + 2);
  uVar59 = *(uint *)(prim + lVar11 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar57].ptr;
  uVar55 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar59);
  p_Var53 = pGVar8[1].intersectionFilterN;
  pvVar9 = pGVar8[2].userPtr;
  _Var10 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var10 + uVar55 * (long)pvVar9);
  fVar94 = *pfVar1;
  fVar128 = pfVar1[1];
  fVar129 = pfVar1[2];
  fVar130 = pfVar1[3];
  puVar2 = (undefined8 *)(_Var10 + (uVar55 + 1) * (long)pvVar9);
  uVar27 = *puVar2;
  uVar29 = puVar2[1];
  pfVar1 = (float *)(_Var10 + (uVar55 + 2) * (long)pvVar9);
  fVar140 = *pfVar1;
  fVar141 = pfVar1[1];
  fVar144 = pfVar1[2];
  fVar149 = pfVar1[3];
  pfVar1 = (float *)(_Var10 + (long)pvVar9 * (uVar55 + 3));
  fVar167 = *pfVar1;
  fVar182 = pfVar1[1];
  fVar184 = pfVar1[2];
  fVar224 = pfVar1[3];
  local_3f0 = local_3f0 - 1 & local_3f0;
  uVar52 = *(ulong *)&pGVar8[1].time_range.upper;
  pauVar3 = (undefined1 (*) [12])(uVar52 + (long)p_Var53 * uVar55);
  auVar31 = *pauVar3;
  fVar210 = *(float *)pauVar3[1];
  pfVar1 = (float *)(uVar52 + (long)p_Var53 * (uVar55 + 1));
  fVar219 = *pfVar1;
  fVar221 = pfVar1[1];
  fVar151 = pfVar1[2];
  fVar164 = pfVar1[3];
  pfVar1 = (float *)(uVar52 + (long)p_Var53 * (uVar55 + 2));
  fVar165 = *pfVar1;
  fVar188 = pfVar1[1];
  fVar205 = pfVar1[2];
  fVar207 = pfVar1[3];
  lVar11 = 0;
  if (local_3f0 != 0) {
    for (; (local_3f0 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
    }
  }
  pfVar1 = (float *)(uVar52 + (long)p_Var53 * (uVar55 + 3));
  fVar235 = *pfVar1;
  fVar237 = pfVar1[1];
  fVar244 = pfVar1[2];
  fVar257 = pfVar1[3];
  if (((local_3f0 != 0) && (uVar55 = local_3f0 - 1 & local_3f0, uVar55 != 0)) &&
     (lVar11 = 0, uVar55 != 0)) {
    for (; (uVar55 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
    }
  }
  fVar261 = *(float *)(ray + k * 4);
  fVar267 = *(float *)(ray + k * 4 + 0x10);
  fVar276 = *(float *)(ray + k * 4 + 0x20);
  fVar306 = (fVar165 * 0.5 + fVar235 * 0.0 + fVar219 * 0.0) - *(float *)*pauVar3 * 0.5;
  fVar318 = (fVar188 * 0.5 + fVar237 * 0.0 + fVar221 * 0.0) - *(float *)(*pauVar3 + 4) * 0.5;
  fVar333 = (fVar205 * 0.5 + fVar244 * 0.0 + fVar151 * 0.0) - *(float *)(*pauVar3 + 8) * 0.5;
  fVar186 = (fVar207 * 0.5 + fVar257 * 0.0 + fVar164 * 0.0) - fVar210 * 0.5;
  p01.field_0.i[0] = (int)uVar27;
  p01.field_0.i[1] = (int)((ulong)uVar27 >> 0x20);
  p01.field_0.i[2] = (int)uVar29;
  p01.field_0.i[3] = (int)((ulong)uVar29 >> 0x20);
  fVar315 = (fVar140 * 0.5 + fVar167 * 0.0 + p01.field_0.v[0] * 0.0) - fVar94 * 0.5;
  fVar316 = (fVar141 * 0.5 + fVar182 * 0.0 + p01.field_0.v[1] * 0.0) - fVar128 * 0.5;
  fVar319 = (fVar144 * 0.5 + fVar184 * 0.0 + p01.field_0.v[2] * 0.0) - fVar129 * 0.5;
  fVar322 = (fVar149 * 0.5 + fVar224 * 0.0 + p01.field_0.v[3] * 0.0) - fVar130 * 0.5;
  fVar324 = *(float *)*pauVar3 * -0.0;
  fVar336 = *(float *)(*pauVar3 + 4) * -0.0;
  fVar339 = *(float *)(*pauVar3 + 8) * -0.0;
  fVar280 = fVar165 * 0.0 + fVar235 * -0.0 + fVar219 + fVar324;
  fVar287 = fVar188 * 0.0 + fVar237 * -0.0 + fVar221 + fVar336;
  fVar295 = fVar205 * 0.0 + fVar244 * -0.0 + fVar151 + fVar339;
  fVar299 = fVar207 * 0.0 + fVar257 * -0.0 + fVar164 + fVar210 * -0.0;
  fVar324 = fVar235 * -0.0 + fVar165 + fVar219 * 0.0 + fVar324;
  fVar336 = fVar237 * -0.0 + fVar188 + fVar221 * 0.0 + fVar336;
  fVar339 = fVar244 * -0.0 + fVar205 + fVar151 * 0.0 + fVar339;
  fVar303 = fVar257 * -0.0 + fVar207 + fVar164 * 0.0 + fVar210 * -0.0;
  fVar341 = fVar140 * 0.0 + fVar167 * -0.0 + p01.field_0.v[0] + fVar94 * -0.0;
  fVar348 = fVar141 * 0.0 + fVar182 * -0.0 + p01.field_0.v[1] + fVar128 * -0.0;
  fVar351 = fVar144 * 0.0 + fVar184 * -0.0 + p01.field_0.v[2] + fVar129 * -0.0;
  fVar353 = fVar149 * 0.0 + fVar224 * -0.0 + p01.field_0.v[3] + fVar130 * -0.0;
  local_548._0_4_ = auVar31._0_4_;
  local_548._4_4_ = auVar31._4_4_;
  fStack_540 = auVar31._8_4_;
  fVar219 = (float)local_548._0_4_ * 0.0 + ((fVar235 * 0.5 + fVar165 * 0.0) - fVar219 * 0.5);
  fVar221 = (float)local_548._4_4_ * 0.0 + ((fVar237 * 0.5 + fVar188 * 0.0) - fVar221 * 0.5);
  fVar151 = fStack_540 * 0.0 + ((fVar244 * 0.5 + fVar205 * 0.0) - fVar151 * 0.5);
  fVar165 = fVar210 * 0.0 + ((fVar257 * 0.5 + fVar207 * 0.0) - fVar164 * 0.5);
  fVar210 = fVar167 * -0.0 + fVar140 + p01.field_0.v[0] * 0.0 + fVar94 * -0.0;
  fVar164 = fVar182 * -0.0 + fVar141 + p01.field_0.v[1] * 0.0 + fVar128 * -0.0;
  fVar188 = fVar184 * -0.0 + fVar144 + p01.field_0.v[2] * 0.0 + fVar129 * -0.0;
  fVar205 = fVar224 * -0.0 + fVar149 + p01.field_0.v[3] * 0.0 + fVar130 * -0.0;
  fVar94 = fVar94 * 0.0 + ((fVar167 * 0.5 + fVar140 * 0.0) - p01.field_0.v[0] * 0.5);
  fVar128 = fVar128 * 0.0 + ((fVar182 * 0.5 + fVar141 * 0.0) - p01.field_0.v[1] * 0.5);
  fVar140 = fVar129 * 0.0 + ((fVar184 * 0.5 + fVar144 * 0.0) - p01.field_0.v[2] * 0.5);
  fVar321 = fVar130 * 0.0 + ((fVar224 * 0.5 + fVar149 * 0.0) - p01.field_0.v[3] * 0.5);
  fVar325 = fVar318 * fVar341 - fVar348 * fVar306;
  fVar348 = fVar333 * fVar348 - fVar351 * fVar318;
  fVar351 = fVar306 * fVar351 - fVar341 * fVar333;
  fVar353 = fVar186 * fVar353 - fVar353 * fVar186;
  fVar207 = fVar318 * fVar315 - fVar316 * fVar306;
  fVar235 = fVar333 * fVar316 - fVar319 * fVar318;
  fVar237 = fVar306 * fVar319 - fVar315 * fVar333;
  fVar149 = fVar221 * fVar210 - fVar164 * fVar219;
  fVar224 = fVar151 * fVar164 - fVar188 * fVar221;
  fVar164 = fVar219 * fVar188 - fVar210 * fVar151;
  fVar188 = fVar165 * fVar205 - fVar205 * fVar165;
  fVar129 = fVar221 * fVar94 - fVar128 * fVar219;
  fVar128 = fVar151 * fVar128 - fVar140 * fVar221;
  fVar140 = fVar219 * fVar140 - fVar94 * fVar151;
  fVar244 = fVar351 * fVar351 + fVar348 * fVar348 + fVar325 * fVar325;
  auVar171 = ZEXT416((uint)fVar244);
  auVar64 = rsqrtss(ZEXT416((uint)fVar244),auVar171);
  fVar94 = auVar64._0_4_;
  fVar257 = fVar94 * 1.5 - fVar94 * fVar94 * fVar244 * 0.5 * fVar94;
  fVar342 = fVar325 * fVar207 + fVar351 * fVar237 + fVar348 * fVar235;
  fVar94 = fVar353 * fVar257;
  auVar64 = rcpss(auVar171,auVar171);
  fVar205 = (2.0 - fVar244 * auVar64._0_4_) * auVar64._0_4_;
  fVar315 = fVar164 * fVar164 + fVar224 * fVar224 + fVar149 * fVar149;
  auVar64 = ZEXT416((uint)fVar315);
  auVar171 = rsqrtss(ZEXT416((uint)fVar315),auVar64);
  fVar130 = auVar171._0_4_;
  fVar182 = fVar130 * 1.5 - fVar130 * fVar130 * fVar315 * 0.5 * fVar130;
  fVar319 = fVar149 * fVar129 + fVar164 * fVar140 + fVar224 * fVar128;
  fVar141 = fVar188 * fVar182;
  auVar64 = rcpss(auVar64,auVar64);
  fVar130 = (2.0 - fVar315 * auVar64._0_4_) * auVar64._0_4_;
  fVar144 = fVar299 * fVar348 * fVar257;
  fVar167 = fVar299 * fVar351 * fVar257;
  fVar184 = fVar299 * fVar325 * fVar257;
  fVar210 = fVar299 * fVar94;
  fVar316 = fVar280 - fVar144;
  fVar341 = fVar287 - fVar167;
  fVar238 = fVar295 - fVar184;
  fVar241 = fVar299 - fVar210;
  fVar268 = fVar299 * fVar205 * (fVar244 * fVar235 - fVar342 * fVar348) * fVar257 +
            fVar186 * fVar348 * fVar257;
  fVar277 = fVar299 * fVar205 * (fVar244 * fVar237 - fVar342 * fVar351) * fVar257 +
            fVar186 * fVar351 * fVar257;
  fVar207 = fVar299 * fVar205 * (fVar244 * fVar207 - fVar342 * fVar325) * fVar257 +
            fVar186 * fVar325 * fVar257;
  fVar284 = fVar299 * fVar205 * (fVar244 * (fVar186 * fVar322 - fVar322 * fVar186) -
                                fVar342 * fVar353) * fVar257 + fVar186 * fVar94;
  fVar144 = fVar144 + fVar280;
  fVar167 = fVar167 + fVar287;
  fVar184 = fVar184 + fVar295;
  fVar210 = fVar210 + fVar299;
  fVar237 = fVar303 * fVar224 * fVar182;
  fVar244 = fVar303 * fVar164 * fVar182;
  fVar257 = fVar303 * fVar149 * fVar182;
  fVar280 = fVar303 * fVar141;
  fVar326 = fVar324 - fVar237;
  fVar334 = fVar336 - fVar244;
  fVar337 = fVar339 - fVar257;
  fVar340 = fVar303 - fVar280;
  fVar94 = fVar303 * fVar130 * (fVar315 * fVar128 - fVar319 * fVar224) * fVar182 +
           fVar165 * fVar224 * fVar182;
  fVar128 = fVar303 * fVar130 * (fVar315 * fVar140 - fVar319 * fVar164) * fVar182 +
            fVar165 * fVar164 * fVar182;
  fVar129 = fVar303 * fVar130 * (fVar315 * fVar129 - fVar319 * fVar149) * fVar182 +
            fVar165 * fVar149 * fVar182;
  fVar130 = fVar303 * fVar130 * (fVar315 * (fVar165 * fVar321 - fVar321 * fVar165) -
                                fVar319 * fVar188) * fVar182 + fVar165 * fVar141;
  fVar237 = fVar237 + fVar324;
  fVar244 = fVar244 + fVar336;
  fVar257 = fVar257 + fVar339;
  fVar280 = fVar280 + fVar303;
  fVar287 = (fVar306 - fVar268) * 0.33333334 + fVar316;
  fVar321 = (fVar318 - fVar277) * 0.33333334 + fVar341;
  fVar336 = (fVar333 - fVar207) * 0.33333334 + fVar238;
  fVar303 = (fVar186 - fVar284) * 0.33333334 + fVar241;
  fVar319 = fVar326 - (fVar219 - fVar94) * 0.33333334;
  fVar348 = fVar334 - (fVar221 - fVar128) * 0.33333334;
  fVar342 = fVar337 - (fVar151 - fVar129) * 0.33333334;
  fVar242 = fVar340 - (fVar165 - fVar130) * 0.33333334;
  fVar219 = fVar237 - (fVar94 + fVar219) * 0.33333334;
  fVar164 = fVar244 - (fVar128 + fVar221) * 0.33333334;
  fVar205 = fVar257 - (fVar129 + fVar151) * 0.33333334;
  fVar235 = fVar280 - (fVar130 + fVar165) * 0.33333334;
  fVar315 = fVar316 - fVar261;
  fVar324 = fVar341 - fVar267;
  fVar339 = fVar238 - fVar276;
  fVar94 = pre->ray_space[k].vx.field_0.m128[0];
  fVar128 = pre->ray_space[k].vx.field_0.m128[1];
  fVar129 = pre->ray_space[k].vy.field_0.m128[0];
  fVar130 = pre->ray_space[k].vy.field_0.m128[1];
  fVar140 = pre->ray_space[k].vz.field_0.m128[0];
  fVar141 = pre->ray_space[k].vz.field_0.m128[1];
  fVar343 = fVar315 * fVar94 + fVar324 * fVar129 + fVar339 * fVar140;
  fVar349 = fVar315 * fVar128 + fVar324 * fVar130 + fVar339 * fVar141;
  auVar80._4_4_ = fVar349;
  auVar80._0_4_ = fVar343;
  fVar245 = fVar287 - fVar261;
  fVar258 = fVar321 - fVar267;
  fVar262 = fVar336 - fVar276;
  fVar246 = fVar245 * fVar94 + fVar258 * fVar129 + fVar262 * fVar140;
  fVar259 = fVar245 * fVar128 + fVar258 * fVar130 + fVar262 * fVar141;
  auVar356._4_4_ = fVar259;
  auVar356._0_4_ = fVar246;
  fVar322 = fVar319 - fVar261;
  fVar351 = fVar348 - fVar267;
  fVar239 = fVar342 - fVar276;
  fVar325 = fVar322 * fVar94 + fVar351 * fVar129 + fVar239 * fVar140;
  fVar353 = fVar322 * fVar128 + fVar351 * fVar130 + fVar239 * fVar141;
  auVar109._4_4_ = fVar353;
  auVar109._0_4_ = fVar325;
  fVar327 = fVar326 - fVar261;
  fVar335 = fVar334 - fVar267;
  fVar338 = fVar337 - fVar276;
  auVar330._0_4_ = fVar327 * fVar94 + fVar335 * fVar129 + fVar338 * fVar140;
  auVar330._4_4_ = fVar327 * fVar128 + fVar335 * fVar130 + fVar338 * fVar141;
  fVar288 = fVar144 - fVar261;
  fVar296 = fVar167 - fVar267;
  fVar300 = fVar184 - fVar276;
  fVar289 = fVar288 * fVar94 + fVar296 * fVar129 + fVar300 * fVar140;
  fVar297 = fVar288 * fVar128 + fVar296 * fVar130 + fVar300 * fVar141;
  fVar268 = (fVar268 + fVar306) * 0.33333334 + fVar144;
  fVar277 = (fVar277 + fVar318) * 0.33333334 + fVar167;
  fVar281 = (fVar207 + fVar333) * 0.33333334 + fVar184;
  fVar284 = (fVar284 + fVar186) * 0.33333334 + fVar210;
  fVar221 = fVar268 - fVar261;
  fVar165 = fVar277 - fVar267;
  fVar207 = fVar281 - fVar276;
  fVar151 = fVar221 * fVar94 + fVar165 * fVar129 + fVar207 * fVar140;
  fVar188 = fVar221 * fVar128 + fVar165 * fVar130 + fVar207 * fVar141;
  auVar356._12_4_ = fVar188;
  auVar356._8_4_ = fVar151;
  fVar149 = fVar219 - fVar261;
  fVar182 = fVar164 - fVar267;
  fVar224 = fVar205 - fVar276;
  fVar306 = fVar149 * fVar94 + fVar182 * fVar129 + fVar224 * fVar140;
  fVar318 = fVar149 * fVar128 + fVar182 * fVar130 + fVar224 * fVar141;
  fVar261 = fVar237 - fVar261;
  fVar267 = fVar244 - fVar267;
  fVar276 = fVar257 - fVar276;
  fVar129 = fVar261 * fVar94 + fVar267 * fVar129 + fVar276 * fVar140;
  fVar128 = fVar261 * fVar128 + fVar267 * fVar130 + fVar276 * fVar141;
  auVar330._12_4_ = fVar128;
  auVar330._8_4_ = fVar129;
  auVar80._8_4_ = fVar289;
  auVar80._12_4_ = fVar297;
  auVar64 = minps(auVar80,auVar356);
  auVar109._8_4_ = fVar306;
  auVar109._12_4_ = fVar318;
  auVar171 = minps(auVar109,auVar330);
  auVar64 = minps(auVar64,auVar171);
  auVar110._4_4_ = fVar349;
  auVar110._0_4_ = fVar343;
  auVar110._8_4_ = fVar289;
  auVar110._12_4_ = fVar297;
  auVar171 = maxps(auVar110,auVar356);
  auVar132._4_4_ = fVar353;
  auVar132._0_4_ = fVar325;
  auVar132._8_4_ = fVar306;
  auVar132._12_4_ = fVar318;
  auVar133 = maxps(auVar132,auVar330);
  auVar111 = maxps(auVar171,auVar133);
  auVar18._4_8_ = auVar133._8_8_;
  auVar18._0_4_ = auVar64._4_4_;
  auVar134._0_8_ = auVar18._0_8_ << 0x20;
  auVar134._8_4_ = auVar64._8_4_;
  auVar134._12_4_ = auVar64._12_4_;
  auVar135._8_8_ = auVar64._8_8_;
  auVar135._0_8_ = auVar134._8_8_;
  auVar171 = minps(auVar64,auVar135);
  auVar19._4_8_ = auVar64._8_8_;
  auVar19._0_4_ = auVar111._4_4_;
  auVar136._0_8_ = auVar19._0_8_ << 0x20;
  auVar136._8_4_ = auVar111._8_4_;
  auVar136._12_4_ = auVar111._12_4_;
  auVar137._8_8_ = auVar111._8_8_;
  auVar137._0_8_ = auVar136._8_8_;
  auVar64 = maxps(auVar111,auVar137);
  auVar81._0_8_ = auVar171._0_8_ & 0x7fffffff7fffffff;
  auVar81._8_4_ = auVar171._8_4_ & 0x7fffffff;
  auVar81._12_4_ = auVar171._12_4_ & 0x7fffffff;
  auVar112._0_8_ = auVar64._0_8_ & 0x7fffffff7fffffff;
  auVar112._8_4_ = auVar64._8_4_ & 0x7fffffff;
  auVar112._12_4_ = auVar64._12_4_ & 0x7fffffff;
  auVar64 = maxps(auVar81,auVar112);
  fVar94 = auVar64._4_4_;
  if (auVar64._4_4_ <= auVar64._0_4_) {
    fVar94 = auVar64._0_4_;
  }
  fVar94 = fVar94 * 9.536743e-07;
  uVar55 = 0;
  fVar130 = *(float *)(ray + k * 4 + 0x30);
  local_548._0_4_ = 0.0;
  local_548._4_4_ = 1.0;
  fStack_540 = 0.0;
  fStack_53c = 0.0;
  local_528.lower = 0.0;
  local_528.upper = 1.0;
LAB_0030f833:
  do {
    fVar140 = 1.0 - (float)local_548._0_4_;
    fVar141 = 1.0 - (float)local_548._0_4_;
    fVar301 = 1.0 - (float)local_548._4_4_;
    fVar304 = 1.0 - (float)local_548._4_4_;
    fVar269 = fVar343 * fVar140 + fVar289 * (float)local_548._0_4_;
    fVar278 = fVar349 * fVar141 + fVar297 * (float)local_548._0_4_;
    fVar282 = fVar343 * fVar301 + fVar289 * (float)local_548._4_4_;
    fVar285 = fVar349 * fVar304 + fVar297 * (float)local_548._4_4_;
    fVar247 = fVar246 * fVar140 + fVar151 * (float)local_548._0_4_;
    fVar260 = fVar259 * fVar141 + fVar188 * (float)local_548._0_4_;
    fVar263 = fVar246 * fVar301 + fVar151 * (float)local_548._4_4_;
    fVar265 = fVar259 * fVar304 + fVar188 * (float)local_548._4_4_;
    fVar355 = fVar325 * fVar140 + fVar306 * (float)local_548._0_4_;
    fVar358 = fVar353 * fVar141 + fVar318 * (float)local_548._0_4_;
    fVar359 = fVar325 * fVar301 + fVar306 * (float)local_548._4_4_;
    fVar360 = fVar353 * fVar304 + fVar318 * (float)local_548._4_4_;
    fVar290 = fVar140 * auVar330._0_4_ + (float)local_548._0_4_ * fVar129;
    fVar298 = fVar141 * auVar330._4_4_ + (float)local_548._0_4_ * fVar128;
    fVar302 = fVar301 * auVar330._0_4_ + (float)local_548._4_4_ * fVar129;
    fVar305 = fVar304 * auVar330._4_4_ + (float)local_548._4_4_ * fVar128;
    fVar328 = (local_528.upper - local_528.lower) * 0.11111111;
    fVar344 = (local_528.upper - local_528.lower) * 0.0 + local_528.lower;
    fVar350 = (local_528.upper - local_528.lower) * 0.33333334 + local_528.lower;
    fVar352 = (local_528.upper - local_528.lower) * 0.6666667 + local_528.lower;
    fVar354 = (local_528.upper - local_528.lower) * 1.0 + local_528.lower;
    fVar301 = 1.0 - fVar344;
    fVar304 = 1.0 - fVar350;
    fVar142 = 1.0 - fVar352;
    fVar143 = 1.0 - fVar354;
    fVar168 = fVar247 * fVar301 + fVar355 * fVar344;
    fVar183 = fVar247 * fVar304 + fVar355 * fVar350;
    fVar185 = fVar247 * fVar142 + fVar355 * fVar352;
    fVar187 = fVar247 * fVar143 + fVar355 * fVar354;
    fVar189 = fVar260 * fVar301 + fVar358 * fVar344;
    fVar206 = fVar260 * fVar304 + fVar358 * fVar350;
    fVar208 = fVar260 * fVar142 + fVar358 * fVar352;
    fVar209 = fVar260 * fVar143 + fVar358 * fVar354;
    fVar140 = (fVar269 * fVar301 + fVar247 * fVar344) * fVar301 + fVar344 * fVar168;
    fVar141 = (fVar269 * fVar304 + fVar247 * fVar350) * fVar304 + fVar350 * fVar183;
    fVar166 = (fVar269 * fVar142 + fVar247 * fVar352) * fVar142 + fVar352 * fVar185;
    fVar247 = (fVar269 * fVar143 + fVar247 * fVar354) * fVar143 + fVar354 * fVar187;
    fVar269 = (fVar278 * fVar301 + fVar260 * fVar344) * fVar301 + fVar344 * fVar189;
    fVar220 = (fVar278 * fVar304 + fVar260 * fVar350) * fVar304 + fVar350 * fVar206;
    fVar222 = (fVar278 * fVar142 + fVar260 * fVar352) * fVar142 + fVar352 * fVar208;
    fVar223 = (fVar278 * fVar143 + fVar260 * fVar354) * fVar143 + fVar354 * fVar209;
    fVar260 = fVar168 * fVar301 + (fVar355 * fVar301 + fVar290 * fVar344) * fVar344;
    fVar168 = fVar183 * fVar304 + (fVar355 * fVar304 + fVar290 * fVar350) * fVar350;
    fVar183 = fVar185 * fVar142 + (fVar355 * fVar142 + fVar290 * fVar352) * fVar352;
    fVar185 = fVar187 * fVar143 + (fVar355 * fVar143 + fVar290 * fVar354) * fVar354;
    fVar187 = fVar189 * fVar301 + (fVar358 * fVar301 + fVar298 * fVar344) * fVar344;
    fVar189 = fVar206 * fVar304 + (fVar358 * fVar304 + fVar298 * fVar350) * fVar350;
    fVar206 = fVar208 * fVar142 + (fVar358 * fVar142 + fVar298 * fVar352) * fVar352;
    fVar208 = fVar209 * fVar143 + (fVar358 * fVar143 + fVar298 * fVar354) * fVar354;
    fVar278 = fVar301 * fVar140 + fVar344 * fVar260;
    fVar290 = fVar304 * fVar141 + fVar350 * fVar168;
    fVar298 = fVar142 * fVar166 + fVar352 * fVar183;
    fVar355 = fVar143 * fVar247 + fVar354 * fVar185;
    fVar307 = fVar301 * fVar269 + fVar344 * fVar187;
    fVar317 = fVar304 * fVar220 + fVar350 * fVar189;
    fVar320 = fVar142 * fVar222 + fVar352 * fVar206;
    fVar323 = fVar143 * fVar223 + fVar354 * fVar208;
    fVar141 = (fVar168 - fVar141) * 3.0 * fVar328;
    fVar168 = (fVar183 - fVar166) * 3.0 * fVar328;
    fVar183 = (fVar185 - fVar247) * 3.0 * fVar328;
    fVar185 = (fVar189 - fVar220) * 3.0 * fVar328;
    fVar189 = (fVar206 - fVar222) * 3.0 * fVar328;
    fVar206 = (fVar208 - fVar223) * 3.0 * fVar328;
    fVar225 = fVar278 + (fVar260 - fVar140) * 3.0 * fVar328;
    fVar236 = fVar290 + fVar141;
    fVar240 = fVar298 + fVar168;
    fVar243 = fVar355 + fVar183;
    fVar140 = fVar307 + (fVar187 - fVar269) * 3.0 * fVar328;
    fVar166 = fVar317 + fVar185;
    fVar247 = fVar320 + fVar189;
    fVar187 = fVar323 + fVar206;
    fVar141 = fVar290 - fVar141;
    fVar168 = fVar298 - fVar168;
    fVar183 = fVar355 - fVar183;
    local_538._0_4_ = fVar317 - fVar185;
    local_538._4_4_ = fVar320 - fVar189;
    fStack_530 = fVar323 - fVar206;
    fStack_52c = 0.0;
    fVar206 = fVar263 * fVar301 + fVar359 * fVar344;
    fVar208 = fVar263 * fVar304 + fVar359 * fVar350;
    fVar209 = fVar263 * fVar142 + fVar359 * fVar352;
    fVar269 = fVar263 * fVar143 + fVar359 * fVar354;
    fVar220 = fVar265 * fVar301 + fVar360 * fVar344;
    fVar222 = fVar265 * fVar304 + fVar360 * fVar350;
    fVar223 = fVar265 * fVar142 + fVar360 * fVar352;
    fVar266 = fVar265 * fVar143 + fVar360 * fVar354;
    fVar185 = (fVar282 * fVar301 + fVar263 * fVar344) * fVar301 + fVar344 * fVar206;
    fVar260 = (fVar282 * fVar304 + fVar263 * fVar350) * fVar304 + fVar350 * fVar208;
    fVar189 = (fVar282 * fVar142 + fVar263 * fVar352) * fVar142 + fVar352 * fVar209;
    fVar282 = (fVar282 * fVar143 + fVar263 * fVar354) * fVar143 + fVar354 * fVar269;
    fVar270 = (fVar285 * fVar301 + fVar265 * fVar344) * fVar301 + fVar344 * fVar220;
    fVar279 = (fVar285 * fVar304 + fVar265 * fVar350) * fVar304 + fVar350 * fVar222;
    fVar283 = (fVar285 * fVar142 + fVar265 * fVar352) * fVar142 + fVar352 * fVar223;
    fVar286 = (fVar285 * fVar143 + fVar265 * fVar354) * fVar143 + fVar354 * fVar266;
    fVar265 = fVar206 * fVar301 + (fVar359 * fVar301 + fVar302 * fVar344) * fVar344;
    fVar285 = fVar208 * fVar304 + (fVar359 * fVar304 + fVar302 * fVar350) * fVar350;
    fVar358 = fVar209 * fVar142 + (fVar359 * fVar142 + fVar302 * fVar352) * fVar352;
    fVar302 = fVar269 * fVar143 + (fVar359 * fVar143 + fVar302 * fVar354) * fVar354;
    fVar248 = fVar220 * fVar301 + (fVar360 * fVar301 + fVar305 * fVar344) * fVar344;
    fVar359 = fVar222 * fVar304 + (fVar360 * fVar304 + fVar305 * fVar350) * fVar350;
    fVar264 = fVar223 * fVar142 + (fVar360 * fVar142 + fVar305 * fVar352) * fVar352;
    fVar266 = fVar266 * fVar143 + (fVar360 * fVar143 + fVar305 * fVar354) * fVar354;
    fVar220 = fVar301 * fVar185 + fVar344 * fVar265;
    fVar222 = fVar304 * fVar260 + fVar350 * fVar285;
    fVar223 = fVar142 * fVar189 + fVar352 * fVar358;
    fVar263 = fVar143 * fVar282 + fVar354 * fVar302;
    fVar206 = fVar301 * fVar270 + fVar344 * fVar248;
    fVar208 = fVar304 * fVar279 + fVar350 * fVar359;
    fVar209 = fVar142 * fVar283 + fVar352 * fVar264;
    fVar269 = fVar143 * fVar286 + fVar354 * fVar266;
    fVar301 = (fVar285 - fVar260) * 3.0 * fVar328;
    fVar142 = (fVar358 - fVar189) * 3.0 * fVar328;
    fVar260 = (fVar302 - fVar282) * 3.0 * fVar328;
    fVar302 = (fVar359 - fVar279) * 3.0 * fVar328;
    fVar359 = (fVar264 - fVar283) * 3.0 * fVar328;
    fVar264 = (fVar266 - fVar286) * 3.0 * fVar328;
    fVar283 = fVar220 + (fVar265 - fVar185) * 3.0 * fVar328;
    fVar286 = fVar222 + fVar301;
    fVar305 = fVar223 + fVar142;
    fVar344 = fVar263 + fVar260;
    fVar248 = fVar206 + (fVar248 - fVar270) * 3.0 * fVar328;
    fVar266 = fVar208 + fVar302;
    fVar270 = fVar209 + fVar359;
    fVar279 = fVar269 + fVar264;
    fVar301 = fVar222 - fVar301;
    fVar142 = fVar223 - fVar142;
    fVar260 = fVar263 - fVar260;
    fVar302 = fVar208 - fVar302;
    fVar359 = fVar209 - fVar359;
    fVar264 = fVar269 - fVar264;
    fVar304 = (fVar222 - fVar290) + (fVar220 - fVar278);
    fVar143 = (fVar223 - fVar298) + (fVar222 - fVar290);
    fVar185 = (fVar263 - fVar355) + (fVar223 - fVar298);
    fVar189 = (fVar263 - fVar355) + 0.0;
    fVar282 = (fVar208 - fVar317) + (fVar206 - fVar307);
    fVar265 = (fVar209 - fVar320) + (fVar208 - fVar317);
    fVar285 = (fVar269 - fVar323) + (fVar209 - fVar320);
    fVar358 = (fVar269 - fVar323) + 0.0;
    auVar212._0_8_ =
         CONCAT44(fVar317 * fVar143 - fVar290 * fVar265,fVar307 * fVar304 - fVar278 * fVar282);
    auVar212._8_4_ = fVar320 * fVar185 - fVar298 * fVar285;
    auVar212._12_4_ = fVar323 * fVar189 - fVar355 * fVar358;
    auVar154._0_4_ = fVar140 * fVar304 - fVar225 * fVar282;
    auVar154._4_4_ = fVar166 * fVar143 - fVar236 * fVar265;
    auVar154._8_4_ = fVar247 * fVar185 - fVar240 * fVar285;
    auVar154._12_4_ = fVar187 * fVar189 - fVar243 * fVar358;
    auVar172._0_8_ =
         CONCAT44((float)local_538._4_4_ * fVar143 - fVar265 * fVar168,
                  (float)local_538._0_4_ * fVar304 - fVar282 * fVar141);
    auVar172._8_4_ = fStack_530 * fVar185 - fVar285 * fVar183;
    auVar172._12_4_ = fVar189 * 0.0 - fVar358 * 0.0;
    auVar312._0_4_ = fVar304 * fVar317 - fVar282 * fVar290;
    auVar312._4_4_ = fVar143 * fVar320 - fVar265 * fVar298;
    auVar312._8_4_ = fVar185 * fVar323 - fVar285 * fVar355;
    auVar312._12_4_ = fVar189 * 0.0 - fVar358 * 0.0;
    auVar250._0_8_ =
         CONCAT44(fVar208 * fVar143 - fVar222 * fVar265,fVar206 * fVar304 - fVar220 * fVar282);
    auVar250._8_4_ = fVar209 * fVar185 - fVar223 * fVar285;
    auVar250._12_4_ = fVar269 * fVar189 - fVar263 * fVar358;
    auVar331._0_4_ = fVar248 * fVar304 - fVar283 * fVar282;
    auVar331._4_4_ = fVar266 * fVar143 - fVar286 * fVar265;
    auVar331._8_4_ = fVar270 * fVar185 - fVar305 * fVar285;
    auVar331._12_4_ = fVar279 * fVar189 - fVar344 * fVar358;
    auVar227._0_8_ =
         CONCAT44(fVar359 * fVar143 - fVar265 * fVar142,fVar302 * fVar304 - fVar282 * fVar301);
    auVar227._8_4_ = fVar264 * fVar185 - fVar285 * fVar260;
    auVar227._12_4_ = fVar189 * 0.0 - fVar358 * 0.0;
    local_a8._0_4_ = fVar304 * fVar208 - fVar282 * fVar222;
    local_a8._4_4_ = fVar143 * fVar209 - fVar265 * fVar223;
    local_a8._8_4_ = fVar185 * fVar269 - fVar285 * fVar263;
    local_a8._12_4_ = fVar189 * 0.0 - fVar358 * 0.0;
    auVar113._8_4_ = auVar212._8_4_;
    auVar113._0_8_ = auVar212._0_8_;
    auVar113._12_4_ = auVar212._12_4_;
    auVar64 = minps(auVar113,auVar154);
    auVar111 = maxps(auVar212,auVar154);
    auVar155._8_4_ = auVar172._8_4_;
    auVar155._0_8_ = auVar172._0_8_;
    auVar155._12_4_ = auVar172._12_4_;
    auVar171 = minps(auVar155,auVar312);
    auVar64 = minps(auVar64,auVar171);
    auVar171 = maxps(auVar172,auVar312);
    auVar133 = maxps(auVar111,auVar171);
    auVar156._8_4_ = auVar250._8_4_;
    auVar156._0_8_ = auVar250._0_8_;
    auVar156._12_4_ = auVar250._12_4_;
    auVar171 = minps(auVar156,auVar331);
    auVar251 = maxps(auVar250,auVar331);
    auVar173._8_4_ = auVar227._8_4_;
    auVar173._0_8_ = auVar227._0_8_;
    auVar173._12_4_ = auVar227._12_4_;
    auVar111 = minps(auVar173,local_a8);
    auVar171 = minps(auVar171,auVar111);
    auVar64 = minps(auVar64,auVar171);
    auVar171 = maxps(auVar227,local_a8);
    auVar171 = maxps(auVar251,auVar171);
    auVar171 = maxps(auVar133,auVar171);
    bVar56 = auVar64._4_4_ <= fVar94;
    bVar13 = auVar64._8_4_ <= fVar94;
    auVar46._4_4_ = -(uint)bVar13;
    auVar46._0_4_ = -(uint)bVar56;
    auVar46._8_4_ = -(uint)(auVar64._12_4_ <= fVar94);
    auVar46._12_4_ = 0;
    auVar117 = auVar46 << 0x20;
    bVar48 = (-fVar94 <= auVar171._0_4_ && auVar64._0_4_ <= fVar94) && bVar15;
    auVar213._0_4_ = -(uint)bVar48;
    bVar49 = (-fVar94 <= auVar171._4_4_ && bVar56) && bVar16;
    auVar213._4_4_ = -(uint)bVar49;
    bVar56 = (-fVar94 <= auVar171._8_4_ && bVar13) && bVar17;
    auVar213._8_4_ = -(uint)bVar56;
    auVar213._12_4_ = 0;
    uVar61 = movmskps((int)uVar52,auVar213);
    uVar52 = (ulong)uVar61;
    if (uVar61 != 0) {
      fVar304 = (fVar222 - fVar220) + (fVar290 - fVar278);
      fVar143 = (fVar223 - fVar222) + (fVar298 - fVar290);
      fVar185 = (fVar263 - fVar223) + (fVar355 - fVar298);
      fVar189 = (0.0 - fVar263) + (0.0 - fVar355);
      fVar282 = (fVar208 - fVar206) + (fVar317 - fVar307);
      fVar265 = (fVar209 - fVar208) + (fVar320 - fVar317);
      fVar285 = (fVar269 - fVar209) + (fVar323 - fVar320);
      fVar358 = (0.0 - fVar269) + (0.0 - fVar323);
      auVar345._0_8_ =
           CONCAT44(fVar317 * fVar143 - fVar290 * fVar265,fVar307 * fVar304 - fVar278 * fVar282);
      auVar345._8_4_ = fVar320 * fVar185 - fVar298 * fVar285;
      auVar345._12_4_ = fVar323 * fVar189 - fVar355 * fVar358;
      auVar157._0_4_ = fVar140 * fVar304 - fVar225 * fVar282;
      auVar157._4_4_ = fVar166 * fVar143 - fVar236 * fVar265;
      auVar157._8_4_ = fVar247 * fVar185 - fVar240 * fVar285;
      auVar157._12_4_ = fVar187 * fVar189 - fVar243 * fVar358;
      auVar228._0_8_ =
           CONCAT44((float)local_538._4_4_ * fVar143 - fVar168 * fVar265,
                    (float)local_538._0_4_ * fVar304 - fVar141 * fVar282);
      auVar228._8_4_ = fStack_530 * fVar185 - fVar183 * fVar285;
      auVar228._12_4_ = fVar189 * 0.0 - fVar358 * 0.0;
      auVar174._0_4_ = fVar317 * fVar304 - fVar290 * fVar282;
      auVar174._4_4_ = fVar320 * fVar143 - fVar298 * fVar265;
      auVar174._8_4_ = fVar323 * fVar185 - fVar355 * fVar285;
      auVar174._12_4_ = fVar189 * 0.0 - fVar358 * 0.0;
      auVar138._0_8_ =
           CONCAT44(fVar208 * fVar143 - fVar222 * fVar265,fVar206 * fVar304 - fVar220 * fVar282);
      auVar138._8_4_ = fVar209 * fVar185 - fVar223 * fVar285;
      auVar138._12_4_ = fVar269 * fVar189 - fVar263 * fVar358;
      auVar271._0_4_ = fVar248 * fVar304 - fVar283 * fVar282;
      auVar271._4_4_ = fVar266 * fVar143 - fVar286 * fVar265;
      auVar271._8_4_ = fVar270 * fVar185 - fVar305 * fVar285;
      auVar271._12_4_ = fVar279 * fVar189 - fVar344 * fVar358;
      auVar313._0_8_ =
           CONCAT44(fVar359 * fVar143 - fVar142 * fVar265,fVar302 * fVar304 - fVar301 * fVar282);
      auVar313._8_4_ = fVar264 * fVar185 - fVar260 * fVar285;
      auVar313._12_4_ = fVar189 * 0.0 - fVar358 * 0.0;
      local_a8._0_4_ = fVar304 * fVar208 - fVar282 * fVar222;
      local_a8._4_4_ = fVar143 * fVar209 - fVar265 * fVar223;
      local_a8._8_4_ = fVar185 * fVar269 - fVar285 * fVar263;
      local_a8._12_4_ = fVar189 * 0.0 - fVar358 * 0.0;
      auVar114._8_4_ = auVar345._8_4_;
      auVar114._0_8_ = auVar345._0_8_;
      auVar114._12_4_ = auVar345._12_4_;
      auVar64 = minps(auVar114,auVar157);
      auVar111 = maxps(auVar345,auVar157);
      auVar158._8_4_ = auVar228._8_4_;
      auVar158._0_8_ = auVar228._0_8_;
      auVar158._12_4_ = auVar228._12_4_;
      auVar171 = minps(auVar158,auVar174);
      auVar64 = minps(auVar64,auVar171);
      auVar171 = maxps(auVar228,auVar174);
      auVar251 = maxps(auVar111,auVar171);
      auVar159._8_4_ = auVar138._8_4_;
      auVar159._0_8_ = auVar138._0_8_;
      auVar159._12_4_ = auVar138._12_4_;
      auVar111 = minps(auVar159,auVar271);
      auVar171 = maxps(auVar138,auVar271);
      auVar175._8_4_ = auVar313._8_4_;
      auVar175._0_8_ = auVar313._0_8_;
      auVar175._12_4_ = auVar313._12_4_;
      auVar133 = minps(auVar175,local_a8);
      auVar111 = minps(auVar111,auVar133);
      auVar64 = minps(auVar64,auVar111);
      auVar111 = maxps(auVar313,local_a8);
      auVar171 = maxps(auVar171,auVar111);
      auVar171 = maxps(auVar251,auVar171);
      bVar13 = auVar64._4_4_ <= fVar94;
      bVar14 = auVar64._8_4_ <= fVar94;
      auVar47._4_4_ = -(uint)bVar14;
      auVar47._0_4_ = -(uint)bVar13;
      auVar47._8_4_ = -(uint)(auVar64._12_4_ <= fVar94);
      auVar47._12_4_ = 0;
      auVar117 = auVar47 << 0x20;
      auVar346._0_4_ = -(uint)((-fVar94 <= auVar171._0_4_ && auVar64._0_4_ <= fVar94) && bVar48);
      auVar346._4_4_ = -(uint)((-fVar94 <= auVar171._4_4_ && bVar13) && bVar49);
      auVar346._8_4_ = -(uint)((-fVar94 <= auVar171._8_4_ && bVar14) && bVar56);
      auVar346._12_4_ = 0;
      uVar61 = movmskps(uVar61,auVar346);
      uVar52 = (ulong)uVar61;
      if (uVar61 != 0) {
        uVar52 = (ulong)(byte)uVar61;
        mask_stack[uVar55] = uVar61 & 0xff;
        cu_stack[uVar55] = local_528;
        cv_stack[uVar55].lower = (float)local_548._0_4_;
        cv_stack[uVar55].upper = (float)local_548._4_4_;
        uVar55 = (ulong)((int)uVar55 + 1);
        local_a8 = _local_548;
      }
    }
LAB_0030fe9a:
    auVar64 = _local_538;
    if ((int)uVar55 == 0) {
      fVar94 = *(float *)(ray + k * 4 + 0x80);
      auVar126._4_4_ = -(uint)(fVar63 <= fVar94);
      auVar126._0_4_ = -(uint)(fVar150 <= fVar94);
      auVar126._8_4_ = -(uint)(fVar91 <= fVar94);
      auVar126._12_4_ = -(uint)(fVar92 <= fVar94);
      uVar57 = movmskps((int)uVar52,auVar126);
      uVar57 = (uint)local_3f0 & uVar57;
      context = pRVar50;
      goto LAB_0030eee4;
    }
    uVar62 = (int)uVar55 - 1;
    uVar52 = (ulong)uVar62;
    uVar61 = mask_stack[uVar52];
    local_548._0_4_ = cv_stack[uVar52].lower;
    local_548._4_4_ = cv_stack[uVar52].upper;
    fStack_540 = 0.0;
    fStack_53c = 0.0;
    uVar12 = 0;
    if (uVar61 != 0) {
      for (; (uVar61 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
      }
    }
    uVar61 = uVar61 - 1 & uVar61;
    mask_stack[uVar52] = uVar61;
    if (uVar61 == 0) {
      uVar55 = (ulong)uVar62;
    }
    fVar301 = (float)(uVar12 + 1) * 0.33333334;
    fVar304 = local_a8._4_4_ * 0.0;
    fVar166 = auVar117._4_4_ * 0.0;
    fVar140 = cu_stack[uVar52].lower;
    fVar141 = cu_stack[uVar52].upper;
    local_528.lower =
         fVar140 * (1.0 - (float)uVar12 * 0.33333334) + fVar141 * (float)uVar12 * 0.33333334;
    local_528.upper = fVar140 * (1.0 - fVar301) + fVar141 * fVar301;
    fVar301 = fVar140 * (0.0 - fVar304) + fVar141 * fVar304;
    fVar141 = fVar140 * (0.0 - fVar166) + fVar141 * fVar166;
    fVar140 = local_528.upper - local_528.lower;
    if (fVar140 < 0.16666667) {
      fVar185 = 1.0 - (float)local_548._0_4_;
      fVar187 = 1.0 - (float)local_548._0_4_;
      fVar189 = 1.0 - (float)local_548._4_4_;
      fVar206 = 1.0 - (float)local_548._4_4_;
      fVar143 = fVar343 * fVar185 + fVar289 * (float)local_548._0_4_;
      fVar183 = fVar349 * fVar187 + fVar297 * (float)local_548._0_4_;
      fVar304 = fVar343 * fVar189 + fVar289 * (float)local_548._4_4_;
      fVar166 = fVar349 * fVar206 + fVar297 * (float)local_548._4_4_;
      fVar168 = fVar246 * fVar185 + fVar151 * (float)local_548._0_4_;
      fVar142 = fVar259 * fVar187 + fVar188 * (float)local_548._0_4_;
      fVar247 = fVar246 * fVar189 + fVar151 * (float)local_548._4_4_;
      fVar260 = fVar259 * fVar206 + fVar188 * (float)local_548._4_4_;
      fVar223 = fVar325 * fVar185 + fVar306 * (float)local_548._0_4_;
      fVar263 = fVar353 * fVar187 + fVar318 * (float)local_548._0_4_;
      fVar265 = fVar325 * fVar189 + fVar306 * (float)local_548._4_4_;
      fVar358 = fVar353 * fVar206 + fVar318 * (float)local_548._4_4_;
      fVar269 = (fVar185 * auVar330._0_4_ + (float)local_548._0_4_ * fVar129) - fVar223;
      fVar278 = (fVar187 * auVar330._4_4_ + (float)local_548._0_4_ * fVar128) - fVar263;
      fVar222 = (fVar189 * auVar330._0_4_ + (float)local_548._4_4_ * fVar129) - fVar265;
      fVar298 = (fVar206 * auVar330._4_4_ + (float)local_548._4_4_ * fVar128) - fVar358;
      fVar185 = local_528.lower * (fVar223 - fVar168) + fVar168;
      fVar187 = local_528.lower * (fVar263 - fVar142) + fVar142;
      fVar220 = local_528.lower * (fVar265 - fVar247) + fVar247;
      fVar290 = local_528.lower * (fVar358 - fVar260) + fVar260;
      fVar355 = (fVar223 - fVar168) * local_528.upper + fVar168;
      fVar282 = (fVar263 - fVar142) * local_528.upper + fVar142;
      fVar285 = (fVar265 - fVar247) * local_528.upper + fVar247;
      fVar302 = (fVar358 - fVar260) * local_528.upper + fVar260;
      fVar189 = local_528.lower * (fVar168 - fVar143) + fVar143;
      fVar206 = local_528.lower * (fVar142 - fVar183) + fVar183;
      fVar208 = local_528.lower * (fVar247 - fVar304) + fVar304;
      fVar209 = local_528.lower * (fVar260 - fVar166) + fVar166;
      fVar189 = (fVar185 - fVar189) * local_528.lower + fVar189;
      fVar206 = (fVar187 - fVar206) * local_528.lower + fVar206;
      fVar208 = (fVar220 - fVar208) * local_528.lower + fVar208;
      fVar209 = (fVar290 - fVar209) * local_528.lower + fVar209;
      fVar185 = (((local_528.lower * fVar269 + fVar223) - fVar185) * local_528.lower + fVar185) -
                fVar189;
      fVar187 = (((local_528.lower * fVar278 + fVar263) - fVar187) * local_528.lower + fVar187) -
                fVar206;
      fVar220 = (((local_528.lower * fVar222 + fVar265) - fVar220) * local_528.lower + fVar220) -
                fVar208;
      fVar290 = (((local_528.lower * fVar298 + fVar358) - fVar290) * local_528.lower + fVar290) -
                fVar209;
      fVar189 = local_528.lower * fVar185 + fVar189;
      fVar206 = local_528.lower * fVar187 + fVar206;
      fVar208 = local_528.lower * fVar220 + fVar208;
      fVar209 = local_528.lower * fVar290 + fVar209;
      fVar143 = (fVar168 - fVar143) * local_528.upper + fVar143;
      fVar183 = (fVar142 - fVar183) * local_528.upper + fVar183;
      fVar304 = (fVar247 - fVar304) * local_528.upper + fVar304;
      fVar166 = (fVar260 - fVar166) * local_528.upper + fVar166;
      fVar143 = (fVar355 - fVar143) * local_528.upper + fVar143;
      fVar183 = (fVar282 - fVar183) * local_528.upper + fVar183;
      fVar304 = (fVar285 - fVar304) * local_528.upper + fVar304;
      fVar166 = (fVar302 - fVar166) * local_528.upper + fVar166;
      fVar168 = (((fVar269 * local_528.upper + fVar223) - fVar355) * local_528.upper + fVar355) -
                fVar143;
      fVar142 = (((fVar278 * local_528.upper + fVar263) - fVar282) * local_528.upper + fVar282) -
                fVar183;
      fVar247 = (((fVar222 * local_528.upper + fVar265) - fVar285) * local_528.upper + fVar285) -
                fVar304;
      fVar260 = (((fVar298 * local_528.upper + fVar358) - fVar302) * local_528.upper + fVar302) -
                fVar166;
      fVar143 = local_528.upper * fVar168 + fVar143;
      fVar183 = local_528.upper * fVar142 + fVar183;
      local_528.lower = local_528.upper * fVar247 + fVar304;
      local_528.upper = local_528.upper * fVar260 + fVar166;
      fVar304 = fVar140 * 0.33333334;
      fVar269 = fVar185 * (float)DAT_01f4afa0 * fVar304 + fVar189;
      fVar278 = fVar187 * DAT_01f4afa0._4_4_ * fVar304 + fVar206;
      fVar220 = fVar220 * DAT_01f4afa0._8_4_ * fVar304 + fVar208;
      fVar290 = fVar290 * DAT_01f4afa0._12_4_ * fVar304 + fVar209;
      fVar222 = fVar143 - fVar304 * fVar168 * (float)DAT_01f4afa0;
      fVar298 = fVar183 - fVar304 * fVar142 * DAT_01f4afa0._4_4_;
      fVar223 = local_528.lower - fVar304 * fVar247 * DAT_01f4afa0._8_4_;
      fVar355 = local_528.upper - fVar304 * fVar260 * DAT_01f4afa0._12_4_;
      auVar20._4_8_ = DAT_01f4afa0._8_8_;
      auVar20._0_4_ = fVar183;
      auVar229._0_8_ = auVar20._0_8_ << 0x20;
      auVar229._8_4_ = local_528.lower;
      auVar229._12_4_ = local_528.upper;
      fVar247 = (local_528.lower - fVar143) + (fVar208 - fVar189);
      fVar260 = (local_528.upper - fVar183) + (fVar209 - fVar206);
      auVar252._0_4_ = fVar298 * fVar260;
      auVar252._4_4_ = fVar298 * fVar260;
      auVar252._8_4_ = fVar355 * fVar260;
      auVar252._12_4_ = fVar355 * fVar260;
      fVar304 = fVar189 * fVar247 + fVar206 * fVar260;
      fVar166 = fVar208 * fVar247 + fVar209 * fVar260;
      fVar185 = fVar269 * fVar247 + fVar278 * fVar260;
      fVar187 = fVar220 * fVar247 + fVar290 * fVar260;
      fVar263 = fVar222 * fVar247 + auVar252._0_4_;
      auVar214._0_8_ = CONCAT44(fVar298 * fVar247 + auVar252._4_4_,fVar263);
      auVar214._8_4_ = fVar223 * fVar247 + auVar252._8_4_;
      auVar214._12_4_ = fVar355 * fVar247 + auVar252._12_4_;
      fVar142 = fVar247 * fVar143 + fVar260 * fVar183;
      fVar282 = fVar247 * local_528.lower + fVar260 * local_528.upper;
      auVar21._4_8_ = auVar252._8_8_;
      auVar21._0_4_ = fVar278 * fVar247 + fVar278 * fVar260;
      auVar253._0_8_ = auVar21._0_8_ << 0x20;
      auVar253._8_4_ = fVar187;
      auVar253._12_4_ = fVar290 * fVar247 + fVar290 * fVar260;
      fVar168 = fVar185;
      if (fVar185 <= fVar304) {
        fVar168 = fVar304;
        fVar304 = fVar185;
      }
      auVar254._8_8_ = auVar253._8_8_;
      auVar254._0_8_ = auVar254._8_8_;
      auVar82._8_4_ = auVar214._8_4_;
      auVar82._0_8_ = auVar214._0_8_;
      auVar82._12_4_ = auVar214._12_4_;
      if (fVar142 <= fVar263) {
        auVar82._0_4_ = fVar142;
      }
      if (auVar82._0_4_ <= fVar304) {
        fVar304 = auVar82._0_4_;
      }
      auVar22._4_8_ = auVar82._8_8_;
      auVar22._0_4_ = fVar247 * fVar183 + fVar260 * fVar183;
      auVar83._0_8_ = auVar22._0_8_ << 0x20;
      auVar83._8_4_ = fVar282;
      auVar83._12_4_ = fVar247 * local_528.upper + fVar260 * local_528.upper;
      if (fVar142 <= fVar263) {
        fVar142 = fVar263;
      }
      local_a8._8_8_ = auVar83._8_8_;
      local_a8._0_8_ = local_a8._8_8_;
      if (fVar142 <= fVar168) {
        fVar142 = fVar168;
      }
      if (fVar187 <= fVar166) {
        auVar254._0_4_ = fVar166;
        fVar166 = fVar187;
      }
      auVar115._8_4_ = auVar214._8_4_;
      auVar115._0_8_ = auVar214._8_8_;
      auVar115._12_4_ = auVar214._12_4_;
      if (fVar282 <= auVar214._8_4_) {
        auVar115._0_4_ = fVar282;
      }
      if (auVar115._0_4_ <= fVar166) {
        fVar166 = auVar115._0_4_;
      }
      if (fVar282 <= auVar214._8_4_) {
        local_a8._0_4_ = auVar214._8_4_;
      }
      if (local_a8._0_4_ <= auVar254._0_4_) {
        local_a8._0_4_ = auVar254._0_4_;
      }
      bVar56 = 3 < (uint)uVar55;
      uVar23 = (undefined3)(uVar62 >> 8);
      uVar52 = (ulong)CONCAT31(uVar23,bVar56);
      fVar168 = local_a8._0_4_;
      if ((0.0001 <= fVar304) || (fVar168 <= -0.0001)) break;
      goto LAB_003101f5;
    }
  } while( true );
  auVar117._0_12_ = ZEXT812(0x38d1b717);
  auVar117._12_4_ = 0;
  if ((fVar166 < 0.0001 && -0.0001 < fVar142) ||
     ((fVar304 < 0.0001 && -0.0001 < fVar142 || (fVar166 < 0.0001 && -0.0001 < fVar168)))) {
LAB_003101f5:
    local_538 = (undefined1  [8])auVar229._8_8_;
    bVar56 = bVar56 || fVar140 < 0.001;
    uVar52 = (ulong)CONCAT31(uVar23,bVar56);
    fVar260 = (float)(~-(uint)(fVar304 < 0.0) & 0x3f800000 | -(uint)(fVar304 < 0.0) & 0xbf800000);
    fVar185 = (float)(~-(uint)(fVar142 < 0.0) & 0x3f800000 | -(uint)(fVar142 < 0.0) & 0xbf800000);
    fVar247 = 0.0;
    if ((fVar260 == fVar185) && (!NAN(fVar260) && !NAN(fVar185))) {
      fVar247 = INFINITY;
    }
    fVar187 = 0.0;
    if ((fVar260 == fVar185) && (!NAN(fVar260) && !NAN(fVar185))) {
      fVar187 = -INFINITY;
    }
    fVar263 = (float)(~-(uint)(fVar166 < 0.0) & 0x3f800000 | -(uint)(fVar166 < 0.0) & 0xbf800000);
    if ((fVar260 != fVar263) || (fVar282 = fVar187, NAN(fVar260) || NAN(fVar263))) {
      if ((fVar166 != fVar304) || (NAN(fVar166) || NAN(fVar304))) {
        fVar166 = -fVar304 / (fVar166 - fVar304);
        fVar166 = (1.0 - fVar166) * 0.0 + fVar166;
        fVar282 = fVar166;
      }
      else {
        fVar166 = 0.0;
        if ((fVar304 != 0.0) || (fVar282 = 1.0, NAN(fVar304))) {
          fVar166 = INFINITY;
          fVar282 = -INFINITY;
        }
      }
      if (fVar166 <= fVar247) {
        fVar247 = fVar166;
      }
      if (fVar282 <= fVar187) {
        fVar282 = fVar187;
      }
    }
    fVar304 = *(float *)(&DAT_01f4bed4 + (ulong)(fVar168 < 0.0) * 4);
    if ((fVar185 != fVar304) || (fVar166 = fVar282, NAN(fVar185) || NAN(fVar304))) {
      if ((fVar168 != fVar142) || (NAN(fVar168) || NAN(fVar142))) {
        fVar260 = -fVar142 / (fVar168 - fVar142);
        fVar260 = (1.0 - fVar260) * 0.0 + fVar260;
        fVar166 = fVar260;
      }
      else {
        fVar260 = 0.0;
        if ((fVar142 != 0.0) || (fVar166 = 1.0, NAN(fVar142))) {
          fVar260 = INFINITY;
          fVar166 = -INFINITY;
        }
      }
      if (fVar260 <= fVar247) {
        fVar247 = fVar260;
      }
      if (fVar166 <= fVar282) {
        fVar166 = fVar282;
      }
    }
    if ((fVar263 != fVar304) || (NAN(fVar263) || NAN(fVar304))) {
      fVar247 = (float)(~-(uint)(fVar247 < 1.0) & 0x3f800000 |
                       (uint)fVar247 & -(uint)(fVar247 < 1.0));
      fVar166 = (float)(~-(uint)(fVar166 < 1.0) & (uint)fVar166 |
                       -(uint)(fVar166 < 1.0) & 0x3f800000);
    }
    auVar116._0_8_ =
         CONCAT44(~-(uint)(fVar166 < 1.0),~-(uint)(fVar247 < 0.0) & (uint)fVar247) &
         0x3f800000ffffffff;
    auVar116._8_8_ = 0;
    auVar117 = auVar116 | ZEXT416((uint)fVar166 & -(uint)(fVar166 < 1.0)) << 0x20;
    fVar304 = auVar117._4_4_;
    local_a8._4_4_ = fVar304;
    local_a8._0_4_ = fVar304;
    local_a8._8_4_ = fVar304;
    local_a8._12_4_ = fVar304;
    if (auVar117._0_4_ <= fVar304) {
      fVar166 = auVar117._0_4_ + -0.1;
      fVar142 = auVar117._8_4_ + 0.0;
      fVar247 = auVar117._12_4_ + 0.0;
      uVar61 = -(uint)(fVar304 + 0.1 < 1.0);
      fVar166 = (float)(~-(uint)(fVar166 < 0.0) & (uint)fVar166);
      fVar304 = (float)(~uVar61 & 0x3f800000 | (uint)(fVar304 + 0.1) & uVar61);
      fVar263 = 1.0 - fVar166;
      fVar282 = 1.0 - fVar166;
      fVar265 = 1.0 - fVar304;
      fVar285 = 1.0 - fVar304;
      fVar260 = fVar189 * fVar263 + fVar208 * fVar166;
      fVar185 = fVar206 * fVar282 + fVar209 * fVar166;
      fVar187 = fVar189 * fVar265 + fVar208 * fVar304;
      fVar189 = fVar206 * fVar285 + fVar209 * fVar304;
      fVar206 = fVar269 * fVar263 + fVar220 * fVar166;
      fVar208 = fVar278 * fVar282 + fVar290 * fVar166;
      fVar209 = fVar269 * fVar265 + fVar220 * fVar304;
      fVar269 = fVar278 * fVar285 + fVar290 * fVar304;
      fVar278 = fVar222 * fVar263 + fVar223 * fVar166;
      fVar220 = fVar298 * fVar282 + fVar355 * fVar166;
      fVar290 = fVar222 * fVar265 + fVar223 * fVar304;
      fVar222 = fVar298 * fVar285 + fVar355 * fVar304;
      fVar298 = fVar263 * fVar143 + local_528.lower * fVar166;
      fVar223 = fVar282 * fVar183 + local_528.upper * fVar166;
      fVar355 = fVar265 * fVar143 + auVar64._8_4_ * fVar304;
      fVar263 = fVar285 * fVar183 + auVar64._12_4_ * fVar304;
      fVar143 = (float)local_548._4_4_ * fVar142;
      fVar183 = (float)local_548._4_4_ * fVar247;
      fVar282 = (float)local_548._0_4_ * (1.0 - fVar304);
      fStack_540 = (float)local_548._0_4_ * (0.0 - fVar142);
      fStack_53c = (float)local_548._0_4_ * (0.0 - fVar247);
      local_548._0_4_ = (float)local_548._0_4_ * (1.0 - fVar166) + (float)local_548._4_4_ * fVar166;
      local_548._4_4_ = fVar282 + (float)local_548._4_4_ * fVar304;
      fStack_540 = fStack_540 + fVar143;
      fStack_53c = fStack_53c + fVar183;
      fVar140 = 1.0 / fVar140;
      auVar118._0_4_ = fVar355 - fVar298;
      auVar118._4_4_ = fVar263 - fVar223;
      auVar118._8_4_ = fVar355 - fVar355;
      auVar118._12_4_ = fVar263 - fVar263;
      auVar147._0_8_ = CONCAT44(fVar222 - fVar220,fVar290 - fVar278);
      auVar147._8_4_ = fVar290 - fVar290;
      auVar147._12_4_ = fVar222 - fVar222;
      auVar176._0_4_ = fVar209 - fVar206;
      auVar176._4_4_ = fVar269 - fVar208;
      auVar176._8_4_ = fVar209 - fVar209;
      auVar176._12_4_ = fVar269 - fVar269;
      auVar255._0_8_ = CONCAT44((fVar208 - fVar185) * 3.0,(fVar206 - fVar260) * 3.0);
      auVar255._8_4_ = (fVar209 - fVar187) * 3.0;
      auVar255._12_4_ = (fVar269 - fVar189) * 3.0;
      auVar160._0_8_ = CONCAT44((fVar220 - fVar208) * 3.0,(fVar278 - fVar206) * 3.0);
      auVar160._8_4_ = (fVar290 - fVar209) * 3.0;
      auVar160._12_4_ = (fVar222 - fVar269) * 3.0;
      auVar291._0_4_ = (fVar298 - fVar278) * 3.0;
      auVar291._4_4_ = (fVar223 - fVar220) * 3.0;
      auVar291._8_4_ = (fVar355 - fVar290) * 3.0;
      auVar291._12_4_ = (fVar263 - fVar222) * 3.0;
      auVar215._8_4_ = auVar160._8_4_;
      auVar215._0_8_ = auVar160._0_8_;
      auVar215._12_4_ = auVar160._12_4_;
      auVar171 = minps(auVar215,auVar291);
      auVar64 = maxps(auVar160,auVar291);
      auVar272._8_4_ = auVar255._8_4_;
      auVar272._0_8_ = auVar255._0_8_;
      auVar272._12_4_ = auVar255._12_4_;
      auVar133 = minps(auVar272,auVar171);
      auVar111 = maxps(auVar255,auVar64);
      auVar24._4_8_ = auVar64._8_8_;
      auVar24._0_4_ = auVar133._4_4_;
      auVar161._0_8_ = auVar24._0_8_ << 0x20;
      auVar161._8_4_ = auVar133._8_4_;
      auVar161._12_4_ = auVar133._12_4_;
      auVar162._8_8_ = auVar133._8_8_;
      auVar162._0_8_ = auVar161._8_8_;
      auVar25._4_8_ = auVar171._8_8_;
      auVar25._0_4_ = auVar111._4_4_;
      auVar216._0_8_ = auVar25._0_8_ << 0x20;
      auVar216._8_4_ = auVar111._8_4_;
      auVar216._12_4_ = auVar111._12_4_;
      auVar217._8_8_ = auVar111._8_8_;
      auVar217._0_8_ = auVar216._8_8_;
      auVar171 = minps(auVar133,auVar162);
      auVar64 = maxps(auVar111,auVar217);
      fVar282 = auVar171._0_4_ * fVar140;
      fVar265 = auVar171._4_4_ * fVar140;
      fVar285 = auVar171._8_4_ * fVar140;
      fVar358 = auVar171._12_4_ * fVar140;
      fVar208 = fVar140 * auVar64._0_4_;
      fVar269 = fVar140 * auVar64._4_4_;
      fVar220 = fVar140 * auVar64._8_4_;
      fVar140 = fVar140 * auVar64._12_4_;
      fVar355 = 1.0 / ((float)local_548._4_4_ - (float)local_548._0_4_);
      auVar84._0_8_ = CONCAT44(fVar189 - fVar185,fVar187 - fVar260);
      auVar84._8_4_ = fVar187 - fVar187;
      auVar84._12_4_ = fVar189 - fVar189;
      auVar230._8_4_ = auVar84._8_4_;
      auVar230._0_8_ = auVar84._0_8_;
      auVar230._12_4_ = auVar84._12_4_;
      auVar111 = minps(auVar230,auVar176);
      auVar64 = maxps(auVar84,auVar176);
      auVar139._8_4_ = auVar147._8_4_;
      auVar139._0_8_ = auVar147._0_8_;
      auVar139._12_4_ = auVar147._12_4_;
      auVar171 = minps(auVar139,auVar118);
      auVar111 = minps(auVar111,auVar171);
      auVar171 = maxps(auVar147,auVar118);
      auVar64 = maxps(auVar64,auVar171);
      fVar298 = auVar111._0_4_ * fVar355;
      fVar223 = auVar111._4_4_ * fVar355;
      fVar263 = fVar355 * auVar64._0_4_;
      fVar355 = fVar355 * auVar64._4_4_;
      local_538._4_4_ = local_548._0_4_;
      local_538._0_4_ = local_528.lower;
      fStack_530 = local_528.upper;
      fStack_52c = (float)local_548._4_4_;
      auVar218._4_4_ = local_548._4_4_;
      auVar218._0_4_ = local_528.upper;
      auVar218._8_4_ = fVar301;
      auVar218._12_4_ = fVar141;
      local_b8 = (local_528.lower + local_528.upper) * 0.5;
      fVar187 = ((float)local_548._0_4_ + (float)local_548._4_4_) * 0.5;
      fVar189 = (local_528.upper + fVar301) * 0.0;
      fVar206 = ((float)local_548._4_4_ + fVar141) * 0.0;
      fVar304 = (fVar246 - fVar343) * local_b8 + fVar343;
      fVar166 = (fVar259 - fVar349) * local_b8 + fVar349;
      fVar142 = (fVar151 - fVar289) * local_b8 + fVar295;
      fVar143 = (fVar188 - fVar297) * local_b8 + fVar299;
      fVar247 = (fVar325 - fVar246) * local_b8 + fVar306;
      fVar183 = (fVar353 - fVar259) * local_b8 + fVar318;
      fVar260 = (fVar306 - fVar151) * local_b8 + fVar151;
      fVar185 = (fVar318 - fVar188) * local_b8 + fVar188;
      fVar304 = (fVar247 - fVar304) * local_b8 + fVar304;
      fVar166 = (fVar183 - fVar166) * local_b8 + fVar166;
      fVar142 = (fVar260 - fVar142) * local_b8 + fVar142;
      fVar143 = (fVar185 - fVar143) * local_b8 + fVar143;
      fVar247 = ((((auVar330._0_4_ - fVar325) * local_b8 + fVar325) - fVar247) * local_b8 + fVar247)
                - fVar304;
      fVar183 = ((((auVar330._4_4_ - fVar353) * local_b8 + fVar353) - fVar183) * local_b8 + fVar183)
                - fVar166;
      fVar260 = ((((fVar129 - fVar306) * local_b8 + fVar333) - fVar260) * local_b8 + fVar260) -
                fVar142;
      fVar185 = ((((fVar128 - fVar318) * local_b8 + fVar186) - fVar185) * local_b8 + fVar185) -
                fVar143;
      fVar304 = local_b8 * fVar247 + fVar304;
      fVar166 = local_b8 * fVar183 + fVar166;
      fVar247 = fVar247 * 3.0;
      fVar183 = fVar183 * 3.0;
      fVar142 = (local_b8 * fVar260 + fVar142) - fVar304;
      fVar143 = (local_b8 * fVar185 + fVar143) - fVar166;
      fVar247 = (fVar260 * 3.0 - fVar247) * fVar187 + fVar247;
      fVar183 = (fVar185 * 3.0 - fVar183) * fVar187 + fVar183;
      auVar148._0_8_ = CONCAT44(fVar247,fVar142) ^ 0x80000000;
      auVar148._8_4_ = fVar247;
      auVar148._12_4_ = fVar247;
      fVar302 = local_528.lower - local_b8;
      fVar225 = (float)local_548._0_4_ - fVar187;
      fVar236 = local_528.upper - fVar189;
      fVar359 = (float)local_548._4_4_ - fVar206;
      fVar240 = local_528.upper - local_b8;
      fVar264 = (float)local_548._4_4_ - fVar187;
      fVar301 = fVar301 - fVar189;
      fVar141 = fVar141 - fVar206;
      fVar304 = fVar142 * fVar187 + fVar304;
      fVar166 = fVar143 * fVar187 + fVar166;
      auVar163._0_8_ = CONCAT44(fVar183,fVar143) ^ 0x8000000000000000;
      auVar163._8_4_ = -fVar183;
      auVar163._12_4_ = -fVar183;
      auVar85._0_4_ = fVar143 * fVar247 - fVar183 * fVar142;
      auVar85._4_4_ = auVar85._0_4_;
      auVar85._8_4_ = auVar85._0_4_;
      auVar85._12_4_ = auVar85._0_4_;
      auVar171 = divps(auVar163,auVar85);
      auVar64 = divps(auVar148,auVar85);
      fVar189 = auVar171._0_4_;
      fVar206 = auVar171._4_4_;
      fVar260 = auVar64._0_4_;
      fVar185 = auVar64._4_4_;
      local_b8 = local_b8 - (fVar166 * fVar260 + fVar304 * fVar189);
      fVar247 = fVar187 - (fVar166 * fVar185 + fVar304 * fVar206);
      fVar183 = fVar187 - (fVar166 * auVar64._8_4_ + fVar304 * auVar171._8_4_);
      fVar187 = fVar187 - (fVar166 * auVar64._12_4_ + fVar304 * auVar171._12_4_);
      auVar119._0_8_ = CONCAT44(fVar206 * fVar298,fVar206 * fVar282);
      auVar119._8_4_ = fVar206 * fVar265;
      auVar119._12_4_ = fVar206 * fVar223;
      auVar86._0_4_ = fVar206 * fVar208;
      auVar86._4_4_ = fVar206 * fVar263;
      auVar86._8_4_ = fVar206 * fVar269;
      auVar86._12_4_ = fVar206 * fVar355;
      auVar357._8_4_ = auVar119._8_4_;
      auVar357._0_8_ = auVar119._0_8_;
      auVar357._12_4_ = auVar119._12_4_;
      auVar133 = minps(auVar357,auVar86);
      auVar64 = maxps(auVar86,auVar119);
      auVar177._0_8_ = CONCAT44(fVar185 * fVar223,fVar185 * fVar265);
      auVar177._8_4_ = fVar185 * fVar285;
      auVar177._12_4_ = fVar185 * fVar358;
      auVar120._0_4_ = fVar185 * fVar269;
      auVar120._4_4_ = fVar185 * fVar355;
      auVar120._8_4_ = fVar185 * fVar220;
      auVar120._12_4_ = fVar185 * fVar140;
      auVar273._8_4_ = auVar177._8_4_;
      auVar273._0_8_ = auVar177._0_8_;
      auVar273._12_4_ = auVar177._12_4_;
      auVar111 = minps(auVar273,auVar120);
      auVar171 = maxps(auVar120,auVar177);
      fVar304 = 0.0 - (auVar171._0_4_ + auVar64._0_4_);
      fVar166 = 1.0 - (auVar171._4_4_ + auVar64._4_4_);
      fVar142 = 0.0 - (auVar171._8_4_ + auVar64._8_4_);
      fVar143 = 0.0 - (auVar171._12_4_ + auVar64._12_4_);
      fVar209 = 0.0 - (auVar111._0_4_ + auVar133._0_4_);
      fVar278 = 1.0 - (auVar111._4_4_ + auVar133._4_4_);
      fVar290 = 0.0 - (auVar111._8_4_ + auVar133._8_4_);
      fVar222 = 0.0 - (auVar111._12_4_ + auVar133._12_4_);
      auVar121._0_8_ = CONCAT44(fVar225 * fVar166,fVar302 * fVar304);
      auVar121._8_4_ = fVar236 * fVar142;
      auVar121._12_4_ = fVar359 * fVar143;
      auVar292._0_8_ = CONCAT44(fVar298 * fVar189,fVar282 * fVar189);
      auVar292._8_4_ = fVar265 * fVar189;
      auVar292._12_4_ = fVar223 * fVar189;
      auVar178._0_4_ = fVar189 * fVar208;
      auVar178._4_4_ = fVar189 * fVar263;
      auVar178._8_4_ = fVar189 * fVar269;
      auVar178._12_4_ = fVar189 * fVar355;
      auVar274._8_4_ = auVar292._8_4_;
      auVar274._0_8_ = auVar292._0_8_;
      auVar274._12_4_ = auVar292._12_4_;
      auVar171 = minps(auVar274,auVar178);
      auVar64 = maxps(auVar178,auVar292);
      auVar231._0_8_ = CONCAT44(fVar223 * fVar260,fVar265 * fVar260);
      auVar231._8_4_ = fVar285 * fVar260;
      auVar231._12_4_ = fVar358 * fVar260;
      auVar293._0_4_ = fVar260 * fVar269;
      auVar293._4_4_ = fVar260 * fVar355;
      auVar293._8_4_ = fVar260 * fVar220;
      auVar293._12_4_ = fVar260 * fVar140;
      auVar347._8_4_ = auVar231._8_4_;
      auVar347._0_8_ = auVar231._0_8_;
      auVar347._12_4_ = auVar231._12_4_;
      auVar133 = minps(auVar347,auVar293);
      auVar275._0_4_ = fVar302 * fVar209;
      auVar275._4_4_ = fVar225 * fVar278;
      auVar275._8_4_ = fVar236 * fVar290;
      auVar275._12_4_ = fVar359 * fVar222;
      auVar87._0_8_ = CONCAT44(fVar166 * fVar264,fVar304 * fVar240);
      auVar87._8_4_ = fVar142 * fVar301;
      auVar87._12_4_ = fVar143 * fVar141;
      auVar204._0_4_ = fVar209 * fVar240;
      auVar204._4_4_ = fVar278 * fVar264;
      auVar204._8_4_ = fVar290 * fVar301;
      auVar204._12_4_ = fVar222 * fVar141;
      auVar111 = maxps(auVar293,auVar231);
      fVar140 = 1.0 - (auVar111._0_4_ + auVar64._0_4_);
      fVar304 = 0.0 - (auVar111._4_4_ + auVar64._4_4_);
      fVar166 = 0.0 - (auVar111._8_4_ + auVar64._8_4_);
      fVar142 = 0.0 - (auVar111._12_4_ + auVar64._12_4_);
      fVar143 = 1.0 - (auVar133._0_4_ + auVar171._0_4_);
      fVar208 = 0.0 - (auVar133._4_4_ + auVar171._4_4_);
      fVar209 = 0.0 - (auVar133._8_4_ + auVar171._8_4_);
      fVar269 = 0.0 - (auVar133._12_4_ + auVar171._12_4_);
      auVar232._0_8_ = CONCAT44(fVar225 * fVar304,fVar302 * fVar140);
      auVar232._8_4_ = fVar236 * fVar166;
      auVar232._12_4_ = fVar359 * fVar142;
      auVar314._0_4_ = fVar302 * fVar143;
      auVar314._4_4_ = fVar225 * fVar208;
      auVar314._8_4_ = fVar236 * fVar209;
      auVar314._12_4_ = fVar359 * fVar269;
      auVar179._0_8_ = CONCAT44(fVar304 * fVar264,fVar140 * fVar240);
      auVar179._8_4_ = fVar166 * fVar301;
      auVar179._12_4_ = fVar142 * fVar141;
      auVar256._0_4_ = fVar143 * fVar240;
      auVar256._4_4_ = fVar208 * fVar264;
      auVar256._8_4_ = fVar209 * fVar301;
      auVar256._12_4_ = fVar269 * fVar141;
      auVar294._8_4_ = auVar232._8_4_;
      auVar294._0_8_ = auVar232._0_8_;
      auVar294._12_4_ = auVar232._12_4_;
      auVar64 = minps(auVar294,auVar314);
      auVar332._8_4_ = auVar179._8_4_;
      auVar332._0_8_ = auVar179._0_8_;
      auVar332._12_4_ = auVar179._12_4_;
      auVar171 = minps(auVar332,auVar256);
      auVar251 = minps(auVar64,auVar171);
      auVar171 = maxps(auVar314,auVar232);
      auVar64 = maxps(auVar256,auVar179);
      auVar111 = maxps(auVar64,auVar171);
      auVar233._8_4_ = auVar121._8_4_;
      auVar233._0_8_ = auVar121._0_8_;
      auVar233._12_4_ = auVar121._12_4_;
      auVar171 = minps(auVar233,auVar275);
      auVar180._8_4_ = auVar87._8_4_;
      auVar180._0_8_ = auVar87._0_8_;
      auVar180._12_4_ = auVar87._12_4_;
      auVar64 = minps(auVar180,auVar204);
      auVar171 = minps(auVar171,auVar64);
      auVar133 = maxps(auVar275,auVar121);
      auVar64 = maxps(auVar204,auVar87);
      auVar64 = maxps(auVar64,auVar133);
      auVar234._0_4_ = auVar251._4_4_ + auVar251._0_4_ + local_b8;
      auVar234._4_4_ = auVar171._4_4_ + auVar171._0_4_ + fVar247;
      auVar234._8_4_ = auVar251._8_4_ + auVar251._4_4_ + fVar183;
      auVar234._12_4_ = auVar251._12_4_ + auVar171._4_4_ + fVar187;
      fVar140 = auVar111._4_4_ + auVar111._0_4_ + local_b8;
      fVar141 = auVar64._4_4_ + auVar64._0_4_ + fVar247;
      auVar88._4_4_ = fVar141;
      auVar88._0_4_ = fVar140;
      auVar117 = maxps(_local_538,auVar234);
      auVar88._8_4_ = auVar111._8_4_ + auVar111._4_4_ + fVar183;
      auVar88._12_4_ = auVar111._12_4_ + auVar64._4_4_ + fVar187;
      auVar64 = minps(auVar88,auVar218);
      iVar58 = -(uint)(auVar64._0_4_ < auVar117._0_4_);
      iVar60 = -(uint)(auVar64._4_4_ < auVar117._4_4_);
      auVar89._4_4_ = iVar60;
      auVar89._0_4_ = iVar58;
      auVar89._8_4_ = iVar60;
      auVar89._12_4_ = iVar60;
      local_a8._8_8_ = auVar89._8_8_;
      local_a8._4_4_ = (float)iVar58;
      local_a8._0_4_ = (float)iVar58;
      iVar58 = movmskpd((uint)(fVar168 < 0.0),local_a8);
      if (iVar58 == 0) {
        bVar51 = 0;
        if ((local_528.lower < auVar234._0_4_) && (fVar140 < local_528.upper)) {
          bVar51 = -(fVar141 < (float)local_548._4_4_) & (float)local_548._0_4_ < auVar234._4_4_;
        }
        bVar51 = bVar56 | bVar51;
        uVar52 = (ulong)CONCAT31(uVar23,bVar51);
        if (bVar51 != 1) goto LAB_0030f833;
        uVar52 = 0xc9;
        do {
          uVar52 = uVar52 - 1;
          if (uVar52 == 0) goto LAB_0030fe9a;
          fVar141 = 1.0 - local_b8;
          fVar168 = local_b8 * local_b8 * local_b8;
          fVar166 = local_b8 * local_b8 * 3.0 * fVar141;
          fVar140 = fVar141 * fVar141 * fVar141;
          fVar142 = local_b8 * 3.0 * fVar141 * fVar141;
          fVar141 = fVar140 * fVar343 +
                    fVar142 * fVar306 + fVar166 * fVar325 + fVar168 * auVar330._0_4_;
          fVar301 = fVar140 * fVar349 +
                    fVar142 * fVar318 + fVar166 * fVar353 + fVar168 * auVar330._4_4_;
          fVar304 = fVar140 * fVar295 + fVar142 * fVar151 + fVar166 * fVar333 + fVar168 * fVar129;
          fVar166 = fVar140 * fVar299 + fVar142 * fVar188 + fVar166 * fVar186 + fVar168 * fVar128;
          fVar168 = (fVar304 - fVar141) * fVar247;
          fVar142 = (fVar166 - fVar301) * fVar247;
          fVar140 = (fVar304 - fVar141) * fVar247 + fVar141;
          fVar304 = (fVar166 - fVar301) * fVar247 + fVar301;
          local_b8 = local_b8 - (fVar304 * fVar260 + fVar140 * fVar189);
          fVar247 = fVar247 - (fVar304 * fVar185 + fVar140 * fVar206);
          fVar166 = ABS(fVar304);
          local_a8._0_8_ = CONCAT44(fVar304,fVar140) & 0x7fffffff7fffffff;
          local_a8._8_4_ = ABS(fVar168 + fVar141);
          local_a8._12_4_ = ABS(fVar142 + fVar301);
          auVar117._0_8_ = CONCAT44(fVar304,fVar304) & 0x7fffffff7fffffff;
          auVar117._8_4_ = (int)fVar166;
          auVar117._12_4_ = (int)fVar166;
          if (fVar166 <= ABS(fVar140)) {
            auVar117._0_4_ = ABS(fVar140);
          }
        } while (fVar94 <= auVar117._0_4_);
        if ((((0.0 <= local_b8) && (local_b8 <= 1.0)) &&
            (local_a8._4_4_ = fVar247, local_a8._0_4_ = fVar247, local_a8._8_4_ = fVar247,
            local_a8._12_4_ = fVar247, 0.0 <= fVar247)) && (fVar247 <= 1.0)) {
          fVar140 = pre->ray_space[k].vx.field_0.m128[2];
          fVar141 = pre->ray_space[k].vy.field_0.m128[2];
          fVar301 = pre->ray_space[k].vz.field_0.m128[2];
          auVar122._0_4_ = fVar315 * fVar140;
          auVar122._4_4_ = fVar324 * fVar141;
          auVar122._8_4_ = fVar339 * fVar301;
          auVar122._12_4_ = (fVar241 - 0.0) * 0.0;
          auVar123._8_8_ = auVar122._8_8_;
          auVar123._0_8_ = auVar123._8_8_;
          auVar117._4_12_ = auVar123._4_12_;
          fVar183 = 1.0 - fVar247;
          fVar143 = 1.0 - local_b8;
          fVar304 = fVar143 * fVar143 * fVar143;
          fVar166 = local_b8 * 3.0 * fVar143 * fVar143;
          fVar142 = local_b8 * local_b8 * local_b8;
          fVar168 = local_b8 * local_b8 * 3.0 * fVar143;
          auVar117._0_4_ =
               ((auVar122._8_4_ + auVar122._4_4_ + auVar122._0_4_) * fVar183 +
               (fVar300 * fVar301 + fVar296 * fVar141 + fVar288 * fVar140) * fVar247) * fVar304 +
               ((fVar262 * fVar301 + fVar258 * fVar141 + fVar245 * fVar140) * fVar183 +
               (fVar207 * fVar301 + fVar165 * fVar141 + fVar221 * fVar140) * fVar247) * fVar166 +
               ((fVar239 * fVar301 + fVar351 * fVar141 + fVar322 * fVar140) * fVar183 +
               (fVar224 * fVar301 + fVar182 * fVar141 + fVar149 * fVar140) * fVar247) * fVar168 +
               (fVar183 * (fVar338 * fVar301 + fVar335 * fVar141 + fVar327 * fVar140) +
               (fVar301 * fVar276 + fVar141 * fVar267 + fVar140 * fVar261) * fVar247) * fVar142;
          if ((fVar130 <= auVar117._0_4_) &&
             (fVar140 = *(float *)(ray + k * 4 + 0x80), auVar117._0_4_ <= fVar140)) {
            fVar185 = 1.0 - fVar247;
            fVar187 = 1.0 - fVar247;
            fVar189 = 1.0 - fVar247;
            fVar206 = 1.0 - fVar247;
            fVar141 = fVar287 * fVar185 + fVar268 * fVar247;
            fVar301 = fVar321 * fVar187 + fVar277 * fVar247;
            fVar183 = fVar336 * fVar189 + fVar281 * fVar247;
            fVar260 = fVar303 * fVar206 + fVar284 * fVar247;
            fVar208 = fVar319 * fVar185 + fVar219 * fVar247;
            fVar269 = fVar348 * fVar187 + fVar164 * fVar247;
            fVar220 = fVar342 * fVar189 + fVar205 * fVar247;
            fVar222 = fVar242 * fVar206 + fVar235 * fVar247;
            fVar209 = fVar208 - fVar141;
            fVar278 = fVar269 - fVar301;
            fVar290 = fVar220 - fVar183;
            fVar298 = fVar222 - fVar260;
            fVar141 = (((fVar141 - (fVar316 * fVar185 + fVar144 * fVar247)) * fVar143 +
                       local_b8 * fVar209) * fVar143 +
                      (fVar209 * fVar143 +
                      ((fVar185 * fVar326 + fVar237 * fVar247) - fVar208) * local_b8) * local_b8) *
                      3.0;
            fVar301 = (((fVar301 - (fVar341 * fVar187 + fVar167 * fVar247)) * fVar143 +
                       local_b8 * fVar278) * fVar143 +
                      (fVar278 * fVar143 +
                      ((fVar187 * fVar334 + fVar244 * fVar247) - fVar269) * local_b8) * local_b8) *
                      3.0;
            fVar183 = (((fVar183 - (fVar238 * fVar189 + fVar184 * fVar247)) * fVar143 +
                       local_b8 * fVar290) * fVar143 +
                      (fVar290 * fVar143 +
                      ((fVar189 * fVar337 + fVar257 * fVar247) - fVar220) * local_b8) * local_b8) *
                      3.0;
            fVar143 = (((fVar260 - (fVar241 * fVar206 + fVar210 * fVar247)) * fVar143 +
                       local_b8 * fVar298) * fVar143 +
                      (fVar298 * fVar143 +
                      ((fVar206 * fVar340 + fVar280 * fVar247) - fVar222) * local_b8) * local_b8) *
                      3.0;
            pGVar8 = (pRVar50->scene->geometries).items[uVar57].ptr;
            uVar52 = (ulong)*(uint *)(ray + k * 4 + 0x90);
            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar260 = fVar304 * (fVar144 - fVar316) +
                        fVar166 * (fVar268 - fVar287) +
                        fVar168 * (fVar219 - fVar319) + fVar142 * (fVar237 - fVar326);
              fVar185 = fVar304 * (fVar167 - fVar341) +
                        fVar166 * (fVar277 - fVar321) +
                        fVar168 * (fVar164 - fVar348) + fVar142 * (fVar244 - fVar334);
              fVar187 = fVar304 * (fVar184 - fVar238) +
                        fVar166 * (fVar281 - fVar336) +
                        fVar168 * (fVar205 - fVar342) + fVar142 * (fVar257 - fVar337);
              fVar304 = fVar304 * (fVar210 - fVar241) +
                        fVar166 * (fVar284 - fVar303) +
                        fVar168 * (fVar235 - fVar242) + fVar142 * (fVar280 - fVar340);
              auVar181._0_4_ = fVar185 * fVar141 - fVar301 * fVar260;
              auVar181._4_4_ = fVar187 * fVar301 - fVar183 * fVar185;
              auVar181._8_4_ = fVar260 * fVar183 - fVar141 * fVar187;
              auVar181._12_4_ = fVar304 * fVar143 - fVar143 * fVar304;
              if ((pRVar50->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                *(float *)(ray + k * 4 + 0x80) = auVar117._0_4_;
                *(float *)(ray + k * 4 + 0xc0) = auVar181._4_4_;
                auVar26._4_8_ = auVar123._8_8_;
                auVar26._0_4_ = auVar181._4_4_;
                auVar124._0_8_ = auVar26._0_8_ << 0x20;
                auVar124._8_4_ = auVar181._8_4_;
                auVar124._12_4_ = auVar181._12_4_;
                auVar117._8_8_ = auVar181._8_8_;
                auVar117._0_8_ = auVar124._8_8_;
                *(float *)(ray + k * 4 + 0xd0) = auVar181._8_4_;
                *(float *)(ray + k * 4 + 0xe0) = auVar181._0_4_;
                *(float *)(ray + k * 4 + 0xf0) = local_b8;
                *(float *)(ray + k * 4 + 0x100) = fVar247;
                *(uint *)(ray + k * 4 + 0x110) = uVar59;
                *(uint *)(ray + k * 4 + 0x120) = uVar57;
                *(uint *)(ray + k * 4 + 0x130) = pRVar50->user->instID[0];
                uVar61 = pRVar50->user->instPrimID[0];
                uVar52 = (ulong)uVar61;
                *(uint *)(ray + k * 4 + 0x140) = uVar61;
              }
              else {
                local_e8 = auVar181._4_4_;
                fStack_e4 = auVar181._4_4_;
                fStack_e0 = auVar181._4_4_;
                fStack_dc = auVar181._4_4_;
                local_d8 = auVar181._8_4_;
                fStack_d4 = auVar181._8_4_;
                fStack_d0 = auVar181._8_4_;
                fStack_cc = auVar181._8_4_;
                local_c8 = auVar181._0_4_;
                fStack_c4 = auVar181._0_4_;
                fStack_c0 = auVar181._0_4_;
                fStack_bc = auVar181._0_4_;
                fStack_b4 = local_b8;
                fStack_b0 = local_b8;
                fStack_ac = local_b8;
                local_98 = CONCAT44(uVar59,uVar59);
                uStack_90 = CONCAT44(uVar59,uVar59);
                local_88 = CONCAT44(uVar57,uVar57);
                uStack_80 = CONCAT44(uVar57,uVar57);
                local_78 = pRVar50->user->instID[0];
                uStack_74 = local_78;
                uStack_70 = local_78;
                uStack_6c = local_78;
                local_68 = pRVar50->user->instPrimID[0];
                uStack_64 = local_68;
                uStack_60 = local_68;
                uStack_5c = local_68;
                *(float *)(ray + k * 4 + 0x80) = auVar117._0_4_;
                local_418 = *local_400;
                args.valid = (int *)local_418;
                args.geometryUserPtr = pGVar8->userPtr;
                args.context = pRVar50->user;
                args.hit = (RTCHitN *)&local_e8;
                args.N = 4;
                p_Var53 = pGVar8->intersectionFilterN;
                args.ray = (RTCRayN *)ray;
                if (p_Var53 != (RTCFilterFunctionN)0x0) {
                  p_Var53 = (RTCFilterFunctionN)(*p_Var53)(&args);
                }
                auVar125._0_4_ = -(uint)(local_418._0_4_ == 0);
                auVar125._4_4_ = -(uint)(local_418._4_4_ == 0);
                auVar125._8_4_ = -(uint)(local_418._8_4_ == 0);
                auVar125._12_4_ = -(uint)(local_418._12_4_ == 0);
                uVar61 = movmskps((int)p_Var53,auVar125);
                pRVar54 = (RTCRayN *)(ulong)(uVar61 ^ 0xf);
                if ((uVar61 ^ 0xf) == 0) {
                  auVar125 = auVar125 ^ _DAT_01f46b70;
                }
                else {
                  p_Var53 = pRVar50->args->filter;
                  auVar64 = local_418;
                  if ((p_Var53 != (RTCFilterFunctionN)0x0) &&
                     (((pRVar50->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    p_Var53 = (RTCFilterFunctionN)(*p_Var53)(&args);
                    auVar64 = local_418;
                  }
                  local_418._0_4_ = -(uint)(auVar64._0_4_ == 0);
                  local_418._4_4_ = -(uint)(auVar64._4_4_ == 0);
                  local_418._8_4_ = -(uint)(auVar64._8_4_ == 0);
                  local_418._12_4_ = -(uint)(auVar64._12_4_ == 0);
                  auVar125 = local_418 ^ _DAT_01f46b70;
                  uVar61 = movmskps((int)p_Var53,local_418);
                  pRVar54 = (RTCRayN *)(ulong)(uVar61 ^ 0xf);
                  if ((uVar61 ^ 0xf) != 0) {
                    uVar61 = *(uint *)(args.hit + 4);
                    uVar62 = *(uint *)(args.hit + 8);
                    uVar28 = *(uint *)(args.hit + 0xc);
                    *(uint *)(args.ray + 0xc0) =
                         ~local_418._0_4_ & *(uint *)args.hit |
                         *(uint *)(args.ray + 0xc0) & local_418._0_4_;
                    *(uint *)(args.ray + 0xc4) =
                         ~local_418._4_4_ & uVar61 | *(uint *)(args.ray + 0xc4) & local_418._4_4_;
                    *(uint *)(args.ray + 200) =
                         ~local_418._8_4_ & uVar62 | *(uint *)(args.ray + 200) & local_418._8_4_;
                    *(uint *)(args.ray + 0xcc) =
                         ~local_418._12_4_ & uVar28 | *(uint *)(args.ray + 0xcc) & local_418._12_4_;
                    uVar61 = *(uint *)(args.hit + 0x14);
                    uVar62 = *(uint *)(args.hit + 0x18);
                    uVar28 = *(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0xd0) =
                         ~local_418._0_4_ & *(uint *)(args.hit + 0x10) |
                         *(uint *)(args.ray + 0xd0) & local_418._0_4_;
                    *(uint *)(args.ray + 0xd4) =
                         ~local_418._4_4_ & uVar61 | *(uint *)(args.ray + 0xd4) & local_418._4_4_;
                    *(uint *)(args.ray + 0xd8) =
                         ~local_418._8_4_ & uVar62 | *(uint *)(args.ray + 0xd8) & local_418._8_4_;
                    *(uint *)(args.ray + 0xdc) =
                         ~local_418._12_4_ & uVar28 | *(uint *)(args.ray + 0xdc) & local_418._12_4_;
                    uVar61 = *(uint *)(args.hit + 0x24);
                    uVar62 = *(uint *)(args.hit + 0x28);
                    uVar28 = *(uint *)(args.hit + 0x2c);
                    *(uint *)(args.ray + 0xe0) =
                         ~local_418._0_4_ & *(uint *)(args.hit + 0x20) |
                         *(uint *)(args.ray + 0xe0) & local_418._0_4_;
                    *(uint *)(args.ray + 0xe4) =
                         ~local_418._4_4_ & uVar61 | *(uint *)(args.ray + 0xe4) & local_418._4_4_;
                    *(uint *)(args.ray + 0xe8) =
                         ~local_418._8_4_ & uVar62 | *(uint *)(args.ray + 0xe8) & local_418._8_4_;
                    *(uint *)(args.ray + 0xec) =
                         ~local_418._12_4_ & uVar28 | *(uint *)(args.ray + 0xec) & local_418._12_4_;
                    uVar61 = *(uint *)(args.hit + 0x34);
                    uVar62 = *(uint *)(args.hit + 0x38);
                    uVar28 = *(uint *)(args.hit + 0x3c);
                    *(uint *)(args.ray + 0xf0) =
                         ~local_418._0_4_ & *(uint *)(args.hit + 0x30) |
                         *(uint *)(args.ray + 0xf0) & local_418._0_4_;
                    *(uint *)(args.ray + 0xf4) =
                         ~local_418._4_4_ & uVar61 | *(uint *)(args.ray + 0xf4) & local_418._4_4_;
                    *(uint *)(args.ray + 0xf8) =
                         ~local_418._8_4_ & uVar62 | *(uint *)(args.ray + 0xf8) & local_418._8_4_;
                    *(uint *)(args.ray + 0xfc) =
                         ~local_418._12_4_ & uVar28 | *(uint *)(args.ray + 0xfc) & local_418._12_4_;
                    uVar61 = *(uint *)(args.hit + 0x44);
                    uVar62 = *(uint *)(args.hit + 0x48);
                    uVar28 = *(uint *)(args.hit + 0x4c);
                    *(uint *)(args.ray + 0x100) =
                         ~local_418._0_4_ & *(uint *)(args.hit + 0x40) |
                         *(uint *)(args.ray + 0x100) & local_418._0_4_;
                    *(uint *)(args.ray + 0x104) =
                         ~local_418._4_4_ & uVar61 | *(uint *)(args.ray + 0x104) & local_418._4_4_;
                    *(uint *)(args.ray + 0x108) =
                         ~local_418._8_4_ & uVar62 | *(uint *)(args.ray + 0x108) & local_418._8_4_;
                    *(uint *)(args.ray + 0x10c) =
                         ~local_418._12_4_ & uVar28 | *(uint *)(args.ray + 0x10c) & local_418._12_4_
                    ;
                    uVar61 = *(uint *)(args.hit + 0x54);
                    uVar62 = *(uint *)(args.hit + 0x58);
                    uVar28 = *(uint *)(args.hit + 0x5c);
                    *(uint *)(args.ray + 0x110) =
                         *(uint *)(args.ray + 0x110) & local_418._0_4_ |
                         ~local_418._0_4_ & *(uint *)(args.hit + 0x50);
                    *(uint *)(args.ray + 0x114) =
                         *(uint *)(args.ray + 0x114) & local_418._4_4_ | ~local_418._4_4_ & uVar61;
                    *(uint *)(args.ray + 0x118) =
                         *(uint *)(args.ray + 0x118) & local_418._8_4_ | ~local_418._8_4_ & uVar62;
                    *(uint *)(args.ray + 0x11c) =
                         *(uint *)(args.ray + 0x11c) & local_418._12_4_ | ~local_418._12_4_ & uVar28
                    ;
                    uVar61 = *(uint *)(args.hit + 100);
                    uVar62 = *(uint *)(args.hit + 0x68);
                    uVar28 = *(uint *)(args.hit + 0x6c);
                    *(uint *)(args.ray + 0x120) =
                         *(uint *)(args.ray + 0x120) & local_418._0_4_ |
                         ~local_418._0_4_ & *(uint *)(args.hit + 0x60);
                    *(uint *)(args.ray + 0x124) =
                         *(uint *)(args.ray + 0x124) & local_418._4_4_ | ~local_418._4_4_ & uVar61;
                    *(uint *)(args.ray + 0x128) =
                         *(uint *)(args.ray + 0x128) & local_418._8_4_ | ~local_418._8_4_ & uVar62;
                    *(uint *)(args.ray + 300) =
                         *(uint *)(args.ray + 300) & local_418._12_4_ | ~local_418._12_4_ & uVar28;
                    uVar61 = *(uint *)(args.hit + 0x74);
                    uVar62 = *(uint *)(args.hit + 0x78);
                    uVar28 = *(uint *)(args.hit + 0x7c);
                    *(uint *)(args.ray + 0x130) =
                         ~local_418._0_4_ & *(uint *)(args.hit + 0x70) |
                         *(uint *)(args.ray + 0x130) & local_418._0_4_;
                    *(uint *)(args.ray + 0x134) =
                         ~local_418._4_4_ & uVar61 | *(uint *)(args.ray + 0x134) & local_418._4_4_;
                    *(uint *)(args.ray + 0x138) =
                         ~local_418._8_4_ & uVar62 | *(uint *)(args.ray + 0x138) & local_418._8_4_;
                    *(uint *)(args.ray + 0x13c) =
                         ~local_418._12_4_ & uVar28 | *(uint *)(args.ray + 0x13c) & local_418._12_4_
                    ;
                    local_418 = ~local_418 & *(undefined1 (*) [16])(args.hit + 0x80) |
                                *(undefined1 (*) [16])(args.ray + 0x140) & local_418;
                    *(undefined1 (*) [16])(args.ray + 0x140) = local_418;
                    pRVar54 = args.ray;
                  }
                }
                auVar117._0_4_ = (float)(auVar125._0_4_ << 0x1f);
                auVar117._4_4_ = auVar125._4_4_ << 0x1f;
                auVar117._8_4_ = auVar125._8_4_ << 0x1f;
                auVar117._12_4_ = auVar125._12_4_ << 0x1f;
                uVar61 = movmskps((int)pRVar54,auVar117);
                uVar52 = (ulong)uVar61;
                local_a8 = local_418;
                if (uVar61 == 0) {
                  *(float *)(ray + k * 4 + 0x80) = fVar140;
                }
              }
            }
          }
        }
      }
    }
  }
  goto LAB_0030fe9a;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }